

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O2

void av1_dr_prediction_z3_sse4_1
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_left,int dx,int dy)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  undefined1 auVar13 [14];
  undefined1 auVar14 [12];
  unkbyte10 Var15;
  undefined1 auVar16 [14];
  undefined1 auVar17 [12];
  unkbyte10 Var18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [14];
  undefined1 auVar21 [12];
  undefined1 auVar22 [14];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [14];
  undefined1 auVar26 [12];
  undefined1 auVar27 [14];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [14];
  undefined1 auVar31 [12];
  undefined1 auVar32 [14];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [14];
  undefined1 auVar36 [12];
  undefined1 auVar37 [14];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [14];
  undefined1 auVar41 [12];
  undefined1 auVar42 [14];
  undefined1 auVar43 [12];
  undefined1 auVar44 [14];
  undefined1 auVar45 [12];
  unkbyte10 Var46;
  undefined1 auVar47 [14];
  undefined1 auVar48 [12];
  unkbyte10 Var49;
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined2 uVar56;
  undefined2 uVar57;
  uint6 uVar58;
  uint6 uVar59;
  unkbyte10 Var60;
  unkbyte10 Var61;
  unkbyte10 Var62;
  unkbyte10 Var63;
  undefined1 auVar64 [11];
  undefined1 auVar65 [11];
  undefined1 auVar66 [11];
  unkbyte10 Var67;
  undefined1 auVar68 [11];
  unkbyte10 Var69;
  undefined1 auVar70 [11];
  undefined1 auVar71 [11];
  undefined1 auVar72 [13];
  undefined1 auVar73 [13];
  undefined1 auVar74 [13];
  undefined1 auVar75 [13];
  undefined1 auVar76 [13];
  undefined1 auVar77 [13];
  undefined6 uVar78;
  undefined6 uVar79;
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined8 uVar82;
  undefined8 uVar83;
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  unkbyte10 Var86;
  unkbyte10 Var87;
  unkbyte10 Var88;
  unkbyte10 Var89;
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [12];
  undefined1 auVar94 [12];
  undefined1 auVar95 [12];
  uint8_t *puVar96;
  byte bVar97;
  uint uVar98;
  long lVar99;
  long lVar100;
  ptrdiff_t pitchSrc;
  int iVar101;
  int i;
  int iVar102;
  long lVar103;
  uint uVar104;
  ulong uVar105;
  ushort uVar106;
  undefined2 uVar375;
  undefined2 uVar376;
  short sVar107;
  undefined1 auVar108 [12];
  ushort uVar164;
  ushort uVar166;
  ushort uVar167;
  ushort uVar168;
  ushort uVar170;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  ushort uVar169;
  ushort uVar171;
  undefined1 auVar120 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar132 [16];
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar145 [16];
  __m128i alVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  short sVar165;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar109 [12];
  undefined1 auVar163 [16];
  undefined2 uVar172;
  undefined1 auVar176 [12];
  undefined1 auVar177 [12];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar187 [16];
  undefined1 auVar194 [16];
  undefined1 auVar201 [16];
  undefined1 auVar203 [16];
  __m128i alVar204;
  undefined1 auVar205 [16];
  undefined1 auVar210 [16];
  undefined2 uVar377;
  undefined2 uVar219;
  undefined4 uVar220;
  undefined4 uVar221;
  undefined1 auVar225 [12];
  undefined2 uVar250;
  undefined2 uVar252;
  undefined1 auVar228 [16];
  undefined1 auVar235 [16];
  undefined4 uVar253;
  uint uVar254;
  __m128i alVar240;
  undefined1 auVar241 [16];
  undefined1 auVar248 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar259 [16];
  __m128i alVar264;
  undefined1 auVar265 [16];
  undefined1 auVar268 [16];
  undefined4 uVar269;
  undefined1 auVar270 [12];
  undefined1 auVar272 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar286 [16];
  __m128i alVar287;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar307 [16];
  __m128i alVar308;
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  ushort uVar361;
  ushort uVar366;
  ushort uVar367;
  ushort uVar368;
  ushort uVar369;
  ushort uVar370;
  ushort uVar371;
  undefined1 in_XMM9 [16];
  undefined1 auVar362 [16];
  ushort uVar372;
  undefined1 auVar363 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  __m128i d [32];
  __m128i dstvec [32];
  __m128i dstvec_h [32];
  longlong local_238 [65];
  undefined1 auVar113 [16];
  undefined1 auVar125 [16];
  undefined1 auVar137 [16];
  undefined1 auVar142 [16];
  undefined1 auVar150 [16];
  undefined1 auVar114 [16];
  undefined1 auVar126 [16];
  undefined1 auVar151 [16];
  undefined1 auVar115 [16];
  undefined1 auVar121 [16];
  undefined1 auVar127 [16];
  undefined1 auVar138 [16];
  undefined1 auVar143 [16];
  undefined1 auVar152 [16];
  undefined1 auVar116 [16];
  undefined1 auVar128 [16];
  undefined1 auVar153 [16];
  undefined1 auVar117 [16];
  undefined1 auVar122 [16];
  undefined1 auVar129 [16];
  undefined1 auVar133 [16];
  undefined1 auVar139 [16];
  undefined1 auVar144 [16];
  undefined1 auVar154 [16];
  undefined1 auVar157 [16];
  undefined1 auVar162 [16];
  undefined1 auVar118 [16];
  undefined1 auVar130 [16];
  undefined1 auVar134 [16];
  undefined1 auVar155 [16];
  undefined1 auVar119 [16];
  undefined1 auVar131 [16];
  undefined1 auVar135 [16];
  undefined1 auVar156 [16];
  undefined1 auVar112 [16];
  undefined6 uVar173;
  undefined8 uVar174;
  undefined1 auVar211 [16];
  undefined1 auVar181 [16];
  undefined1 auVar188 [16];
  undefined1 auVar195 [16];
  undefined1 auVar206 [16];
  undefined1 auVar212 [16];
  undefined1 auVar182 [16];
  undefined1 auVar189 [16];
  undefined1 auVar196 [16];
  undefined1 auVar175 [12];
  undefined1 auVar213 [16];
  undefined1 auVar183 [16];
  undefined1 auVar190 [16];
  undefined1 auVar197 [16];
  undefined1 auVar207 [16];
  undefined1 auVar214 [16];
  undefined1 auVar184 [16];
  undefined1 auVar191 [16];
  undefined1 auVar198 [16];
  undefined1 auVar178 [14];
  undefined1 auVar209 [16];
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar185 [16];
  undefined1 auVar192 [16];
  undefined1 auVar199 [16];
  undefined1 auVar208 [16];
  undefined1 auVar216 [16];
  undefined1 auVar186 [16];
  undefined1 auVar193 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar217 [16];
  undefined6 uVar222;
  undefined8 uVar223;
  undefined1 auVar226 [12];
  undefined1 auVar232 [16];
  undefined1 auVar242 [16];
  undefined1 auVar229 [16];
  undefined1 auVar236 [16];
  undefined1 auVar224 [12];
  undefined1 auVar243 [16];
  undefined1 auVar233 [16];
  undefined1 auVar244 [16];
  undefined1 auVar230 [16];
  undefined1 auVar237 [16];
  undefined1 auVar227 [14];
  undefined1 auVar239 [16];
  undefined1 auVar245 [16];
  undefined1 auVar249 [16];
  undefined1 auVar234 [16];
  undefined1 auVar246 [16];
  undefined1 auVar238 [16];
  undefined1 auVar247 [16];
  undefined1 auVar231 [16];
  undefined4 uVar251;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar257 [16];
  undefined1 auVar266 [16];
  undefined1 auVar263 [16];
  undefined1 auVar258 [16];
  undefined1 auVar267 [16];
  undefined1 auVar273 [16];
  undefined1 auVar283 [16];
  undefined1 auVar271 [12];
  undefined1 auVar274 [16];
  undefined1 auVar291 [16];
  undefined1 auVar275 [16];
  undefined1 auVar284 [16];
  undefined1 auVar276 [16];
  undefined1 auVar292 [16];
  undefined1 auVar277 [16];
  undefined1 auVar280 [16];
  undefined1 auVar285 [16];
  undefined1 auVar294 [16];
  undefined1 auVar278 [16];
  undefined1 auVar293 [16];
  undefined1 auVar279 [16];
  undefined1 auVar297 [16];
  undefined1 auVar312 [16];
  undefined1 auVar298 [16];
  undefined1 auVar305 [16];
  undefined1 auVar313 [16];
  undefined1 auVar299 [16];
  undefined1 auVar314 [16];
  undefined1 auVar300 [16];
  undefined1 auVar306 [16];
  undefined1 auVar315 [16];
  undefined1 auVar301 [16];
  undefined1 auVar316 [16];
  undefined1 auVar302 [16];
  undefined1 auVar317 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  
  iVar101 = (int)left;
  bVar97 = (byte)upsample_left;
  if (bw != bh) {
    if (bw < bh) {
      if (bw * 2 == bh) {
        switch(bw << 0x1e | bw - 4U >> 2) {
        case 0:
          iVar101 = 0xb << (bVar97 & 0x1f);
          auVar179 = pshufb(ZEXT116(left[iVar101]),(undefined1  [16])0x0);
          lVar99 = 0;
          auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
          auVar318 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
          uVar98 = dy;
          for (; lVar99 != 0x40; lVar99 = lVar99 + 0x10) {
            iVar102 = (int)uVar98 >> (6 - bVar97 & 0x1f);
            uVar104 = iVar101 - iVar102 >> (bVar97 & 0x1f);
            if ((int)uVar104 < 1) goto LAB_002e6051;
            uVar105 = (ulong)uVar104;
            if (7 < uVar104) {
              uVar105 = 8;
            }
            auVar110 = *(undefined1 (*) [16])(left + iVar102);
            if (upsample_left == 0) {
              auVar320 = *(undefined1 (*) [16])(left + (long)iVar102 + 1);
              auVar324 = ZEXT416(uVar98 >> 1 & 0x1f);
              auVar324 = pshuflw(auVar324,auVar324,0);
              auVar330._0_4_ = auVar324._0_4_;
              auVar330._4_4_ = auVar330._0_4_;
              auVar330._8_4_ = auVar330._0_4_;
              auVar330._12_4_ = auVar330._0_4_;
            }
            else {
              auVar110 = pshufb(auVar110,_DAT_00468e70);
              auVar320 = auVar110 >> 0x40;
              auVar324 = pshuflw(ZEXT416(uVar98),ZEXT416(uVar98),0);
              auVar328._0_4_ = auVar324._0_4_;
              auVar328._4_4_ = auVar328._0_4_;
              auVar328._8_4_ = auVar328._0_4_;
              auVar328._12_4_ = auVar328._0_4_;
              auVar324 = psllw(auVar328,ZEXT416((uint)upsample_left));
              auVar329._0_2_ = auVar324._0_2_ >> 1;
              auVar329._2_2_ = auVar324._2_2_ >> 1;
              auVar329._4_2_ = auVar324._4_2_ >> 1;
              auVar329._6_2_ = auVar324._6_2_ >> 1;
              auVar329._8_2_ = auVar324._8_2_ >> 1;
              auVar329._10_2_ = auVar324._10_2_ >> 1;
              auVar329._12_2_ = auVar324._12_2_ >> 1;
              auVar329._14_2_ = auVar324._14_2_ >> 1;
              auVar330 = auVar329 & auVar318;
            }
            auVar324 = pmovzxbw(in_XMM9,auVar110);
            auVar373 = pmovzxbw(in_XMM10,auVar320);
            auVar362 = psllw(auVar324,5);
            in_XMM10._0_2_ = (auVar373._0_2_ - auVar324._0_2_) * auVar330._0_2_;
            in_XMM10._2_2_ = (auVar373._2_2_ - auVar324._2_2_) * auVar330._2_2_;
            in_XMM10._4_2_ = (auVar373._4_2_ - auVar324._4_2_) * auVar330._4_2_;
            in_XMM10._6_2_ = (auVar373._6_2_ - auVar324._6_2_) * auVar330._6_2_;
            in_XMM10._8_2_ = (auVar373._8_2_ - auVar324._8_2_) * auVar330._8_2_;
            in_XMM10._10_2_ = (auVar373._10_2_ - auVar324._10_2_) * auVar330._10_2_;
            in_XMM10._12_2_ = (auVar373._12_2_ - auVar324._12_2_) * auVar330._12_2_;
            in_XMM10._14_2_ = (auVar373._14_2_ - auVar324._14_2_) * auVar330._14_2_;
            uVar361 = (ushort)(auVar362._0_2_ + auVar255._0_2_ + in_XMM10._0_2_) >> 5;
            uVar366 = (ushort)(auVar362._2_2_ + auVar255._2_2_ + in_XMM10._2_2_) >> 5;
            uVar367 = (ushort)(auVar362._4_2_ + auVar255._4_2_ + in_XMM10._4_2_) >> 5;
            uVar368 = (ushort)(auVar362._6_2_ + auVar255._6_2_ + in_XMM10._6_2_) >> 5;
            uVar369 = (ushort)(auVar362._8_2_ + auVar255._8_2_ + in_XMM10._8_2_) >> 5;
            uVar370 = (ushort)(auVar362._10_2_ + auVar255._10_2_ + in_XMM10._10_2_) >> 5;
            uVar371 = (ushort)(auVar362._12_2_ + auVar255._12_2_ + in_XMM10._12_2_) >> 5;
            uVar372 = (ushort)(auVar362._14_2_ + auVar255._14_2_ + in_XMM10._14_2_) >> 5;
            auVar123._0_2_ = CONCAT11(0,auVar110[8]);
            auVar123[2] = auVar110[9];
            auVar123[3] = 0;
            auVar123[4] = auVar110[10];
            auVar123[5] = 0;
            auVar123[6] = auVar110[0xb];
            auVar123[7] = 0;
            auVar123[8] = auVar110[0xc];
            auVar123[9] = 0;
            auVar123[10] = auVar110[0xd];
            auVar123[0xb] = 0;
            auVar123[0xc] = auVar110[0xe];
            auVar123[0xd] = 0;
            auVar123[0xe] = auVar110[0xf];
            auVar123[0xf] = 0;
            auVar324 = psllw(auVar123,5);
            uVar106 = (ushort)(auVar324._0_2_ + auVar255._0_2_ +
                              (auVar320[8] - auVar123._0_2_) * auVar330._0_2_) >> 5;
            uVar164 = (ushort)(auVar324._2_2_ + auVar255._2_2_ +
                              ((ushort)auVar320[9] - (ushort)auVar110[9]) * auVar330._2_2_) >> 5;
            uVar166 = (ushort)(auVar324._4_2_ + auVar255._4_2_ +
                              ((ushort)auVar320[10] - (ushort)auVar110[10]) * auVar330._4_2_) >> 5;
            uVar167 = (ushort)(auVar324._6_2_ + auVar255._6_2_ +
                              ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * auVar330._6_2_) >> 5
            ;
            uVar168 = (ushort)(auVar324._8_2_ + auVar255._8_2_ +
                              ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * auVar330._8_2_) >> 5
            ;
            uVar169 = (ushort)(auVar324._10_2_ + auVar255._10_2_ +
                              ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * auVar330._10_2_) >>
                      5;
            uVar170 = (ushort)(auVar324._12_2_ + auVar255._12_2_ +
                              ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * auVar330._12_2_) >>
                      5;
            uVar171 = (ushort)(auVar324._14_2_ + auVar255._14_2_ +
                              ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * auVar330._14_2_) >>
                      5;
            in_XMM9[1] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 - (0xff < uVar366);
            in_XMM9[0] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361);
            in_XMM9[2] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
            in_XMM9[3] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
            in_XMM9[4] = (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
            in_XMM9[5] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
            in_XMM9[6] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
            in_XMM9[7] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
            in_XMM9[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
            in_XMM9[9] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
            in_XMM9[10] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
            in_XMM9[0xb] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
            in_XMM9[0xc] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
            in_XMM9[0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
            in_XMM9[0xe] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
            in_XMM9[0xf] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
            auVar110 = pblendvb(auVar179,in_XMM9,(undefined1  [16])Mask[0][uVar105]);
            *(undefined1 (*) [16])((long)d[0] + lVar99) = auVar110;
            uVar98 = uVar98 + dy;
          }
          goto LAB_002e6057;
        case 1:
          iVar101 = 0x17 << (bVar97 & 0x1f);
          auVar179 = pshufb(ZEXT116(left[iVar101]),(undefined1  [16])0x0);
          lVar99 = 0;
          auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
          auVar318 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
          uVar98 = dy;
          for (; lVar99 != 0x80; lVar99 = lVar99 + 0x10) {
            iVar102 = (int)uVar98 >> (6 - bVar97 & 0x1f);
            uVar104 = iVar101 - iVar102 >> (bVar97 & 0x1f);
            if ((int)uVar104 < 1) goto LAB_002e7b8e;
            uVar105 = (ulong)uVar104;
            if (0xf < uVar104) {
              uVar105 = 0x10;
            }
            auVar110 = *(undefined1 (*) [16])(left + iVar102);
            if (upsample_left == 0) {
              auVar320 = *(undefined1 (*) [16])(left + (long)iVar102 + 1);
              auVar324 = ZEXT416(uVar98 >> 1 & 0x1f);
              auVar324 = pshuflw(auVar324,auVar324,0);
              auVar354._0_4_ = auVar324._0_4_;
              auVar354._4_4_ = auVar354._0_4_;
              auVar354._8_4_ = auVar354._0_4_;
              auVar354._12_4_ = auVar354._0_4_;
            }
            else {
              auVar110 = pshufb(auVar110,_DAT_00468e70);
              auVar320 = auVar110 >> 0x40;
              auVar324 = pshuflw(ZEXT416(uVar98),ZEXT416(uVar98),0);
              auVar352._0_4_ = auVar324._0_4_;
              auVar352._4_4_ = auVar352._0_4_;
              auVar352._8_4_ = auVar352._0_4_;
              auVar352._12_4_ = auVar352._0_4_;
              auVar324 = psllw(auVar352,ZEXT416((uint)upsample_left));
              auVar353._0_2_ = auVar324._0_2_ >> 1;
              auVar353._2_2_ = auVar324._2_2_ >> 1;
              auVar353._4_2_ = auVar324._4_2_ >> 1;
              auVar353._6_2_ = auVar324._6_2_ >> 1;
              auVar353._8_2_ = auVar324._8_2_ >> 1;
              auVar353._10_2_ = auVar324._10_2_ >> 1;
              auVar353._12_2_ = auVar324._12_2_ >> 1;
              auVar353._14_2_ = auVar324._14_2_ >> 1;
              auVar354 = auVar353 & auVar318;
            }
            auVar324 = pmovzxbw(in_XMM9,auVar110);
            auVar373 = pmovzxbw(in_XMM10,auVar320);
            auVar362 = psllw(auVar324,5);
            in_XMM10._0_2_ = (auVar373._0_2_ - auVar324._0_2_) * auVar354._0_2_;
            in_XMM10._2_2_ = (auVar373._2_2_ - auVar324._2_2_) * auVar354._2_2_;
            in_XMM10._4_2_ = (auVar373._4_2_ - auVar324._4_2_) * auVar354._4_2_;
            in_XMM10._6_2_ = (auVar373._6_2_ - auVar324._6_2_) * auVar354._6_2_;
            in_XMM10._8_2_ = (auVar373._8_2_ - auVar324._8_2_) * auVar354._8_2_;
            in_XMM10._10_2_ = (auVar373._10_2_ - auVar324._10_2_) * auVar354._10_2_;
            in_XMM10._12_2_ = (auVar373._12_2_ - auVar324._12_2_) * auVar354._12_2_;
            in_XMM10._14_2_ = (auVar373._14_2_ - auVar324._14_2_) * auVar354._14_2_;
            uVar361 = (ushort)(auVar362._0_2_ + auVar255._0_2_ + in_XMM10._0_2_) >> 5;
            uVar366 = (ushort)(auVar362._2_2_ + auVar255._2_2_ + in_XMM10._2_2_) >> 5;
            uVar367 = (ushort)(auVar362._4_2_ + auVar255._4_2_ + in_XMM10._4_2_) >> 5;
            uVar368 = (ushort)(auVar362._6_2_ + auVar255._6_2_ + in_XMM10._6_2_) >> 5;
            uVar369 = (ushort)(auVar362._8_2_ + auVar255._8_2_ + in_XMM10._8_2_) >> 5;
            uVar370 = (ushort)(auVar362._10_2_ + auVar255._10_2_ + in_XMM10._10_2_) >> 5;
            uVar371 = (ushort)(auVar362._12_2_ + auVar255._12_2_ + in_XMM10._12_2_) >> 5;
            uVar372 = (ushort)(auVar362._14_2_ + auVar255._14_2_ + in_XMM10._14_2_) >> 5;
            auVar161._0_2_ = CONCAT11(0,auVar110[8]);
            auVar161[2] = auVar110[9];
            auVar161[3] = 0;
            auVar161[4] = auVar110[10];
            auVar161[5] = 0;
            auVar161[6] = auVar110[0xb];
            auVar161[7] = 0;
            auVar161[8] = auVar110[0xc];
            auVar161[9] = 0;
            auVar161[10] = auVar110[0xd];
            auVar161[0xb] = 0;
            auVar161[0xc] = auVar110[0xe];
            auVar161[0xd] = 0;
            auVar161[0xe] = auVar110[0xf];
            auVar161[0xf] = 0;
            auVar324 = psllw(auVar161,5);
            uVar106 = (ushort)(auVar324._0_2_ + auVar255._0_2_ +
                              (auVar320[8] - auVar161._0_2_) * auVar354._0_2_) >> 5;
            uVar164 = (ushort)(auVar324._2_2_ + auVar255._2_2_ +
                              ((ushort)auVar320[9] - (ushort)auVar110[9]) * auVar354._2_2_) >> 5;
            uVar166 = (ushort)(auVar324._4_2_ + auVar255._4_2_ +
                              ((ushort)auVar320[10] - (ushort)auVar110[10]) * auVar354._4_2_) >> 5;
            uVar167 = (ushort)(auVar324._6_2_ + auVar255._6_2_ +
                              ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * auVar354._6_2_) >> 5
            ;
            uVar168 = (ushort)(auVar324._8_2_ + auVar255._8_2_ +
                              ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * auVar354._8_2_) >> 5
            ;
            uVar169 = (ushort)(auVar324._10_2_ + auVar255._10_2_ +
                              ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * auVar354._10_2_) >>
                      5;
            uVar170 = (ushort)(auVar324._12_2_ + auVar255._12_2_ +
                              ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * auVar354._12_2_) >>
                      5;
            uVar171 = (ushort)(auVar324._14_2_ + auVar255._14_2_ +
                              ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * auVar354._14_2_) >>
                      5;
            in_XMM9[1] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 - (0xff < uVar366);
            in_XMM9[0] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361);
            in_XMM9[2] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
            in_XMM9[3] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
            in_XMM9[4] = (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
            in_XMM9[5] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
            in_XMM9[6] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
            in_XMM9[7] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
            in_XMM9[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
            in_XMM9[9] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
            in_XMM9[10] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
            in_XMM9[0xb] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
            in_XMM9[0xc] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
            in_XMM9[0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
            in_XMM9[0xe] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
            in_XMM9[0xf] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
            auVar110 = pblendvb(auVar179,in_XMM9,(undefined1  [16])Mask[0][uVar105]);
            *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar110;
            uVar98 = uVar98 + dy;
          }
          goto LAB_002e7b97;
        default:
          return;
        case 3:
          auVar179 = pshufb(ZEXT116(left[0x2f]),(undefined1  [16])0x0);
          lVar99 = 0;
          auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
          lVar100 = 0;
          uVar98 = dy;
          do {
            if (lVar100 == 0x10) break;
            iVar101 = (int)uVar98 >> 6;
            lVar103 = lVar99;
            if (iVar101 < 0x2f) {
              uVar104 = -(iVar101 + -0x2f);
              auVar318 = ZEXT416(uVar98 >> 1 & 0x1f);
              auVar318 = pshuflw(auVar318,auVar318,0);
              for (lVar103 = 0; lVar103 != 0x20; lVar103 = lVar103 + 0x10) {
                auVar289 = auVar179;
                if (lVar103 < (int)uVar104) {
                  auVar110 = *(undefined1 (*) [16])(left + lVar103 + iVar101);
                  auVar320 = *(undefined1 (*) [16])(left + lVar103 + (long)iVar101 + 1);
                  auVar324 = pmovzxbw(auVar179,auVar110);
                  auVar373 = pmovzxbw(in_XMM7,auVar320);
                  auVar362 = psllw(auVar324,5);
                  sVar107 = auVar318._0_2_;
                  in_XMM7._0_2_ = (auVar373._0_2_ - auVar324._0_2_) * sVar107;
                  sVar165 = auVar318._2_2_;
                  in_XMM7._2_2_ = (auVar373._2_2_ - auVar324._2_2_) * sVar165;
                  in_XMM7._4_2_ = (auVar373._4_2_ - auVar324._4_2_) * sVar107;
                  in_XMM7._6_2_ = (auVar373._6_2_ - auVar324._6_2_) * sVar165;
                  in_XMM7._8_2_ = (auVar373._8_2_ - auVar324._8_2_) * sVar107;
                  in_XMM7._10_2_ = (auVar373._10_2_ - auVar324._10_2_) * sVar165;
                  in_XMM7._12_2_ = (auVar373._12_2_ - auVar324._12_2_) * sVar107;
                  in_XMM7._14_2_ = (auVar373._14_2_ - auVar324._14_2_) * sVar165;
                  uVar106 = (ushort)(auVar362._0_2_ + auVar255._0_2_ + in_XMM7._0_2_) >> 5;
                  uVar164 = (ushort)(auVar362._2_2_ + auVar255._2_2_ + in_XMM7._2_2_) >> 5;
                  uVar166 = (ushort)(auVar362._4_2_ + auVar255._4_2_ + in_XMM7._4_2_) >> 5;
                  uVar167 = (ushort)(auVar362._6_2_ + auVar255._6_2_ + in_XMM7._6_2_) >> 5;
                  uVar168 = (ushort)(auVar362._8_2_ + auVar255._8_2_ + in_XMM7._8_2_) >> 5;
                  uVar169 = (ushort)(auVar362._10_2_ + auVar255._10_2_ + in_XMM7._10_2_) >> 5;
                  uVar170 = (ushort)(auVar362._12_2_ + auVar255._12_2_ + in_XMM7._12_2_) >> 5;
                  uVar171 = (ushort)(auVar362._14_2_ + auVar255._14_2_ + in_XMM7._14_2_) >> 5;
                  auVar310._0_2_ = CONCAT11(0,auVar110[8]);
                  auVar310[2] = auVar110[9];
                  auVar310[3] = 0;
                  auVar310[4] = auVar110[10];
                  auVar310[5] = 0;
                  auVar310[6] = auVar110[0xb];
                  auVar310[7] = 0;
                  auVar310[8] = auVar110[0xc];
                  auVar310[9] = 0;
                  auVar310[10] = auVar110[0xd];
                  auVar310[0xb] = 0;
                  auVar310[0xc] = auVar110[0xe];
                  auVar310[0xd] = 0;
                  auVar310[0xe] = auVar110[0xf];
                  auVar310[0xf] = 0;
                  auVar324 = psllw(auVar310,5);
                  uVar361 = (ushort)(auVar324._0_2_ + auVar255._0_2_ +
                                    (auVar320[8] - auVar310._0_2_) * sVar107) >> 5;
                  uVar366 = (ushort)(auVar324._2_2_ + auVar255._2_2_ +
                                    ((ushort)auVar320[9] - (ushort)auVar110[9]) * sVar165) >> 5;
                  uVar367 = (ushort)(auVar324._4_2_ + auVar255._4_2_ +
                                    ((ushort)auVar320[10] - (ushort)auVar110[10]) * sVar107) >> 5;
                  uVar368 = (ushort)(auVar324._6_2_ + auVar255._6_2_ +
                                    ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * sVar165) >> 5;
                  uVar369 = (ushort)(auVar324._8_2_ + auVar255._8_2_ +
                                    ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * sVar107) >> 5;
                  uVar370 = (ushort)(auVar324._10_2_ + auVar255._10_2_ +
                                    ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * sVar165) >> 5;
                  uVar371 = (ushort)(auVar324._12_2_ + auVar255._12_2_ +
                                    ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * sVar107) >> 5;
                  uVar372 = (ushort)(auVar324._14_2_ + auVar255._14_2_ +
                                    ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * sVar165) >> 5;
                  auVar289[1] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 -
                                (0xff < uVar164);
                  auVar289[0] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 -
                                (0xff < uVar106);
                  auVar289[2] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 -
                                (0xff < uVar166);
                  auVar289[3] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 -
                                (0xff < uVar167);
                  auVar289[4] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 -
                                (0xff < uVar168);
                  auVar289[5] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 -
                                (0xff < uVar169);
                  auVar289[6] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 -
                                (0xff < uVar170);
                  auVar289[7] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 -
                                (0xff < uVar171);
                  auVar289[8] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 -
                                (0xff < uVar361);
                  auVar289[9] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 -
                                (0xff < uVar366);
                  auVar289[10] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 -
                                 (0xff < uVar367);
                  auVar289[0xb] =
                       (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
                  auVar289[0xc] =
                       (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
                  auVar289[0xd] =
                       (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
                  auVar289[0xe] =
                       (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
                  auVar289[0xf] =
                       (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
                }
                *(undefined1 (*) [16])((long)d[0] + lVar103) = auVar289;
              }
              if (0x1f < uVar104) {
                uVar104 = 0x20;
              }
              auVar5._8_8_ = d[0][1];
              auVar5._0_8_ = d[0][0];
              alVar287 = (__m128i)pblendvb(auVar179,auVar5,
                                           *(undefined1 (*) [16])(Mask[0][0] + (uVar104 << 4)));
              auVar8[1] = d[1][0]._1_1_;
              auVar8[0] = (undefined1)d[1][0];
              auVar8[2] = d[1][0]._2_1_;
              auVar8[3] = d[1][0]._3_1_;
              auVar8[4] = d[1][0]._4_1_;
              auVar8[5] = d[1][0]._5_1_;
              auVar8[6] = d[1][0]._6_1_;
              auVar8[7] = d[1][0]._7_1_;
              auVar8[8] = (undefined1)d[1][1];
              auVar8[9] = d[1][1]._1_1_;
              auVar8[10] = d[1][1]._2_1_;
              auVar8[0xb] = d[1][1]._3_1_;
              auVar8[0xc] = d[1][1]._4_1_;
              auVar8[0xd] = d[1][1]._5_1_;
              auVar8[0xe] = d[1][1]._6_1_;
              auVar8[0xf] = d[1][1]._7_1_;
              alVar308 = (__m128i)pblendvb(auVar179,auVar8,
                                           *(undefined1 (*) [16])(Mask[1][0] + (uVar104 << 4)));
              dstvec[lVar100] = alVar287;
              dstvec_h[lVar100] = alVar308;
              uVar98 = uVar98 + dy;
            }
            else {
              for (; lVar103 != 0x100; lVar103 = lVar103 + 0x10) {
                *(undefined1 (*) [16])((long)dstvec[0] + lVar103) = auVar179;
                *(undefined1 (*) [16])((long)dstvec_h[0] + lVar103) = auVar179;
              }
            }
            lVar100 = lVar100 + 1;
            lVar99 = lVar99 + 0x10;
          } while (iVar101 < 0x2f);
          transpose16x16_sse2(dstvec,d);
          transpose16x16_sse2(dstvec_h,(__m128i *)local_238);
          for (lVar99 = 0; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
            uVar174 = *(undefined8 *)((long)d[0] + lVar99 + 8);
            *(undefined8 *)dst = *(undefined8 *)((long)d[0] + lVar99);
            *(undefined8 *)(dst + 8) = uVar174;
            uVar174 = *(undefined8 *)((long)local_238 + lVar99 + 8);
            *(undefined8 *)(dst + stride * 0x10) = *(undefined8 *)((long)local_238 + lVar99);
            *(undefined8 *)(dst + stride * 0x10 + 8) = uVar174;
            dst = dst + stride;
          }
          return;
        case 7:
          iVar102 = 0x20;
        }
      }
      else {
        if (bw != 0x10) {
          if (bw == 8) {
            auVar179 = pshufb(ZEXT116(left[0x27]),(undefined1  [16])0x0);
            lVar99 = 0;
            auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
            lVar100 = 0;
            uVar98 = dy;
            do {
              if (lVar100 == 8) break;
              iVar101 = (int)uVar98 >> 6;
              lVar103 = lVar99;
              if (iVar101 < 0x27) {
                uVar104 = -(iVar101 + -0x27);
                auVar318 = ZEXT416(uVar98 >> 1 & 0x1f);
                auVar318 = pshuflw(auVar318,auVar318,0);
                for (lVar103 = 0; lVar103 != 0x20; lVar103 = lVar103 + 0x10) {
                  auVar288 = auVar179;
                  if (lVar103 < (int)uVar104) {
                    auVar110 = *(undefined1 (*) [16])(left + lVar103 + iVar101);
                    auVar320 = *(undefined1 (*) [16])(left + lVar103 + (long)iVar101 + 1);
                    auVar324 = pmovzxbw(auVar179,auVar110);
                    auVar373 = pmovzxbw(in_XMM7,auVar320);
                    auVar362 = psllw(auVar324,5);
                    sVar107 = auVar318._0_2_;
                    in_XMM7._0_2_ = (auVar373._0_2_ - auVar324._0_2_) * sVar107;
                    sVar165 = auVar318._2_2_;
                    in_XMM7._2_2_ = (auVar373._2_2_ - auVar324._2_2_) * sVar165;
                    in_XMM7._4_2_ = (auVar373._4_2_ - auVar324._4_2_) * sVar107;
                    in_XMM7._6_2_ = (auVar373._6_2_ - auVar324._6_2_) * sVar165;
                    in_XMM7._8_2_ = (auVar373._8_2_ - auVar324._8_2_) * sVar107;
                    in_XMM7._10_2_ = (auVar373._10_2_ - auVar324._10_2_) * sVar165;
                    in_XMM7._12_2_ = (auVar373._12_2_ - auVar324._12_2_) * sVar107;
                    in_XMM7._14_2_ = (auVar373._14_2_ - auVar324._14_2_) * sVar165;
                    uVar106 = (ushort)(auVar362._0_2_ + auVar255._0_2_ + in_XMM7._0_2_) >> 5;
                    uVar164 = (ushort)(auVar362._2_2_ + auVar255._2_2_ + in_XMM7._2_2_) >> 5;
                    uVar166 = (ushort)(auVar362._4_2_ + auVar255._4_2_ + in_XMM7._4_2_) >> 5;
                    uVar167 = (ushort)(auVar362._6_2_ + auVar255._6_2_ + in_XMM7._6_2_) >> 5;
                    uVar168 = (ushort)(auVar362._8_2_ + auVar255._8_2_ + in_XMM7._8_2_) >> 5;
                    uVar169 = (ushort)(auVar362._10_2_ + auVar255._10_2_ + in_XMM7._10_2_) >> 5;
                    uVar170 = (ushort)(auVar362._12_2_ + auVar255._12_2_ + in_XMM7._12_2_) >> 5;
                    uVar171 = (ushort)(auVar362._14_2_ + auVar255._14_2_ + in_XMM7._14_2_) >> 5;
                    auVar309._0_2_ = CONCAT11(0,auVar110[8]);
                    auVar309[2] = auVar110[9];
                    auVar309[3] = 0;
                    auVar309[4] = auVar110[10];
                    auVar309[5] = 0;
                    auVar309[6] = auVar110[0xb];
                    auVar309[7] = 0;
                    auVar309[8] = auVar110[0xc];
                    auVar309[9] = 0;
                    auVar309[10] = auVar110[0xd];
                    auVar309[0xb] = 0;
                    auVar309[0xc] = auVar110[0xe];
                    auVar309[0xd] = 0;
                    auVar309[0xe] = auVar110[0xf];
                    auVar309[0xf] = 0;
                    auVar324 = psllw(auVar309,5);
                    uVar361 = (ushort)(auVar324._0_2_ + auVar255._0_2_ +
                                      (auVar320[8] - auVar309._0_2_) * sVar107) >> 5;
                    uVar366 = (ushort)(auVar324._2_2_ + auVar255._2_2_ +
                                      ((ushort)auVar320[9] - (ushort)auVar110[9]) * sVar165) >> 5;
                    uVar367 = (ushort)(auVar324._4_2_ + auVar255._4_2_ +
                                      ((ushort)auVar320[10] - (ushort)auVar110[10]) * sVar107) >> 5;
                    uVar368 = (ushort)(auVar324._6_2_ + auVar255._6_2_ +
                                      ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * sVar165) >>
                              5;
                    uVar369 = (ushort)(auVar324._8_2_ + auVar255._8_2_ +
                                      ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * sVar107) >>
                              5;
                    uVar370 = (ushort)(auVar324._10_2_ + auVar255._10_2_ +
                                      ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * sVar165) >>
                              5;
                    uVar371 = (ushort)(auVar324._12_2_ + auVar255._12_2_ +
                                      ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * sVar107) >>
                              5;
                    uVar372 = (ushort)(auVar324._14_2_ + auVar255._14_2_ +
                                      ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * sVar165) >>
                              5;
                    auVar288[1] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 -
                                  (0xff < uVar164);
                    auVar288[0] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 -
                                  (0xff < uVar106);
                    auVar288[2] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 -
                                  (0xff < uVar166);
                    auVar288[3] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 -
                                  (0xff < uVar167);
                    auVar288[4] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 -
                                  (0xff < uVar168);
                    auVar288[5] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 -
                                  (0xff < uVar169);
                    auVar288[6] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 -
                                  (0xff < uVar170);
                    auVar288[7] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 -
                                  (0xff < uVar171);
                    auVar288[8] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 -
                                  (0xff < uVar361);
                    auVar288[9] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 -
                                  (0xff < uVar366);
                    auVar288[10] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 -
                                   (0xff < uVar367);
                    auVar288[0xb] =
                         (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
                    auVar288[0xc] =
                         (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
                    auVar288[0xd] =
                         (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
                    auVar288[0xe] =
                         (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
                    auVar288[0xf] =
                         (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
                  }
                  *(undefined1 (*) [16])((long)d[0] + lVar103) = auVar288;
                }
                if (0x1f < uVar104) {
                  uVar104 = 0x20;
                }
                auVar4._8_8_ = d[0][1];
                auVar4._0_8_ = d[0][0];
                alVar287 = (__m128i)pblendvb(auVar179,auVar4,
                                             *(undefined1 (*) [16])(Mask[0][0] + (uVar104 << 4)));
                auVar7[1] = d[1][0]._1_1_;
                auVar7[0] = (undefined1)d[1][0];
                auVar7[2] = d[1][0]._2_1_;
                auVar7[3] = d[1][0]._3_1_;
                auVar7[4] = d[1][0]._4_1_;
                auVar7[5] = d[1][0]._5_1_;
                auVar7[6] = d[1][0]._6_1_;
                auVar7[7] = d[1][0]._7_1_;
                auVar7[8] = (undefined1)d[1][1];
                auVar7[9] = d[1][1]._1_1_;
                auVar7[10] = d[1][1]._2_1_;
                auVar7[0xb] = d[1][1]._3_1_;
                auVar7[0xc] = d[1][1]._4_1_;
                auVar7[0xd] = d[1][1]._5_1_;
                auVar7[0xe] = d[1][1]._6_1_;
                auVar7[0xf] = d[1][1]._7_1_;
                alVar308 = (__m128i)pblendvb(auVar179,auVar7,
                                             *(undefined1 (*) [16])(Mask[1][0] + (uVar104 << 4)));
                dstvec[lVar100] = alVar287;
                dstvec_h[lVar100] = alVar308;
                uVar98 = uVar98 + dy;
              }
              else {
                for (; lVar103 != 0x80; lVar103 = lVar103 + 0x10) {
                  *(undefined1 (*) [16])((long)dstvec[0] + lVar103) = auVar179;
                  *(undefined1 (*) [16])((long)dstvec_h[0] + lVar103) = auVar179;
                }
              }
              lVar100 = lVar100 + 1;
              lVar99 = lVar99 + 0x10;
            } while (iVar101 < 0x27);
            for (lVar99 = 0x80; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
              *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])((long)dstvec_h[0] + lVar99) = (undefined1  [16])0x0;
            }
            transpose16x16_sse2(dstvec,d);
            transpose16x16_sse2(dstvec_h,(__m128i *)local_238);
            puVar96 = dst;
            for (lVar99 = 0; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
              *(undefined8 *)puVar96 = *(undefined8 *)((long)d[0] + lVar99);
              puVar96 = puVar96 + stride;
            }
            puVar96 = dst + stride * 0x10;
            for (lVar99 = 0; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
              *(undefined8 *)puVar96 = *(undefined8 *)((long)local_238 + lVar99);
              puVar96 = puVar96 + stride;
            }
            return;
          }
          if (bw != 4) {
            return;
          }
          iVar101 = 0x13 << (bVar97 & 0x1f);
          auVar179 = pshufb(ZEXT116(left[iVar101]),(undefined1  [16])0x0);
          lVar99 = 0;
          auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
          auVar318 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
          uVar98 = dy;
          for (; lVar99 != 0x40; lVar99 = lVar99 + 0x10) {
            iVar102 = (int)uVar98 >> (6 - bVar97 & 0x1f);
            uVar104 = iVar101 - iVar102 >> (bVar97 & 0x1f);
            if ((int)uVar104 < 1) goto LAB_002e64a1;
            uVar105 = (ulong)uVar104;
            if (0xf < uVar104) {
              uVar105 = 0x10;
            }
            auVar110 = *(undefined1 (*) [16])(left + iVar102);
            if (upsample_left == 0) {
              auVar320 = *(undefined1 (*) [16])(left + (long)iVar102 + 1);
              auVar324 = ZEXT416(uVar98 >> 1 & 0x1f);
              auVar324 = pshuflw(auVar324,auVar324,0);
              auVar336._0_4_ = auVar324._0_4_;
              auVar336._4_4_ = auVar336._0_4_;
              auVar336._8_4_ = auVar336._0_4_;
              auVar336._12_4_ = auVar336._0_4_;
            }
            else {
              auVar110 = pshufb(auVar110,_DAT_00468e70);
              auVar320 = auVar110 >> 0x40;
              auVar324 = pshuflw(ZEXT416(uVar98),ZEXT416(uVar98),0);
              auVar334._0_4_ = auVar324._0_4_;
              auVar334._4_4_ = auVar334._0_4_;
              auVar334._8_4_ = auVar334._0_4_;
              auVar334._12_4_ = auVar334._0_4_;
              auVar324 = psllw(auVar334,ZEXT416((uint)upsample_left));
              auVar335._0_2_ = auVar324._0_2_ >> 1;
              auVar335._2_2_ = auVar324._2_2_ >> 1;
              auVar335._4_2_ = auVar324._4_2_ >> 1;
              auVar335._6_2_ = auVar324._6_2_ >> 1;
              auVar335._8_2_ = auVar324._8_2_ >> 1;
              auVar335._10_2_ = auVar324._10_2_ >> 1;
              auVar335._12_2_ = auVar324._12_2_ >> 1;
              auVar335._14_2_ = auVar324._14_2_ >> 1;
              auVar336 = auVar335 & auVar318;
            }
            auVar324 = pmovzxbw(in_XMM9,auVar110);
            auVar373 = pmovzxbw(in_XMM10,auVar320);
            auVar362 = psllw(auVar324,5);
            in_XMM10._0_2_ = (auVar373._0_2_ - auVar324._0_2_) * auVar336._0_2_;
            in_XMM10._2_2_ = (auVar373._2_2_ - auVar324._2_2_) * auVar336._2_2_;
            in_XMM10._4_2_ = (auVar373._4_2_ - auVar324._4_2_) * auVar336._4_2_;
            in_XMM10._6_2_ = (auVar373._6_2_ - auVar324._6_2_) * auVar336._6_2_;
            in_XMM10._8_2_ = (auVar373._8_2_ - auVar324._8_2_) * auVar336._8_2_;
            in_XMM10._10_2_ = (auVar373._10_2_ - auVar324._10_2_) * auVar336._10_2_;
            in_XMM10._12_2_ = (auVar373._12_2_ - auVar324._12_2_) * auVar336._12_2_;
            in_XMM10._14_2_ = (auVar373._14_2_ - auVar324._14_2_) * auVar336._14_2_;
            uVar361 = (ushort)(auVar362._0_2_ + auVar255._0_2_ + in_XMM10._0_2_) >> 5;
            uVar366 = (ushort)(auVar362._2_2_ + auVar255._2_2_ + in_XMM10._2_2_) >> 5;
            uVar367 = (ushort)(auVar362._4_2_ + auVar255._4_2_ + in_XMM10._4_2_) >> 5;
            uVar368 = (ushort)(auVar362._6_2_ + auVar255._6_2_ + in_XMM10._6_2_) >> 5;
            uVar369 = (ushort)(auVar362._8_2_ + auVar255._8_2_ + in_XMM10._8_2_) >> 5;
            uVar370 = (ushort)(auVar362._10_2_ + auVar255._10_2_ + in_XMM10._10_2_) >> 5;
            uVar371 = (ushort)(auVar362._12_2_ + auVar255._12_2_ + in_XMM10._12_2_) >> 5;
            uVar372 = (ushort)(auVar362._14_2_ + auVar255._14_2_ + in_XMM10._14_2_) >> 5;
            auVar140._0_2_ = CONCAT11(0,auVar110[8]);
            auVar140[2] = auVar110[9];
            auVar140[3] = 0;
            auVar140[4] = auVar110[10];
            auVar140[5] = 0;
            auVar140[6] = auVar110[0xb];
            auVar140[7] = 0;
            auVar140[8] = auVar110[0xc];
            auVar140[9] = 0;
            auVar140[10] = auVar110[0xd];
            auVar140[0xb] = 0;
            auVar140[0xc] = auVar110[0xe];
            auVar140[0xd] = 0;
            auVar140[0xe] = auVar110[0xf];
            auVar140[0xf] = 0;
            auVar324 = psllw(auVar140,5);
            uVar106 = (ushort)(auVar324._0_2_ + auVar255._0_2_ +
                              (auVar320[8] - auVar140._0_2_) * auVar336._0_2_) >> 5;
            uVar164 = (ushort)(auVar324._2_2_ + auVar255._2_2_ +
                              ((ushort)auVar320[9] - (ushort)auVar110[9]) * auVar336._2_2_) >> 5;
            uVar166 = (ushort)(auVar324._4_2_ + auVar255._4_2_ +
                              ((ushort)auVar320[10] - (ushort)auVar110[10]) * auVar336._4_2_) >> 5;
            uVar167 = (ushort)(auVar324._6_2_ + auVar255._6_2_ +
                              ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * auVar336._6_2_) >> 5
            ;
            uVar168 = (ushort)(auVar324._8_2_ + auVar255._8_2_ +
                              ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * auVar336._8_2_) >> 5
            ;
            uVar169 = (ushort)(auVar324._10_2_ + auVar255._10_2_ +
                              ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * auVar336._10_2_) >>
                      5;
            uVar170 = (ushort)(auVar324._12_2_ + auVar255._12_2_ +
                              ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * auVar336._12_2_) >>
                      5;
            uVar171 = (ushort)(auVar324._14_2_ + auVar255._14_2_ +
                              ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * auVar336._14_2_) >>
                      5;
            in_XMM9[1] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 - (0xff < uVar366);
            in_XMM9[0] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361);
            in_XMM9[2] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
            in_XMM9[3] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
            in_XMM9[4] = (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
            in_XMM9[5] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
            in_XMM9[6] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
            in_XMM9[7] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
            in_XMM9[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
            in_XMM9[9] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
            in_XMM9[10] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
            in_XMM9[0xb] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
            in_XMM9[0xc] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
            in_XMM9[0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
            in_XMM9[0xe] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
            in_XMM9[0xf] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
            auVar110 = pblendvb(auVar179,in_XMM9,(undefined1  [16])Mask[0][uVar105]);
            *(undefined1 (*) [16])((long)d[0] + lVar99) = auVar110;
            uVar98 = uVar98 + dy;
          }
          goto LAB_002e64a7;
        }
        iVar102 = 0x10;
      }
      pitchSrc = 0x40;
      dr_prediction_z1_64xN_sse4_1(iVar102,(uint8_t *)dstvec,0x40,left,dy,iVar101);
      iVar101 = 0x40;
      goto LAB_002e7fd8;
    }
    if (bh * 2 != bw) {
      if (bh == 0x10) {
        iVar101 = 0x4f << (bVar97 & 0x1f);
        auVar179 = pshufb(ZEXT116(left[iVar101]),(undefined1  [16])0x0);
        lVar99 = 0;
        auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
        auVar318 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
        uVar98 = dy;
        for (; lVar99 != 0x400; lVar99 = lVar99 + 0x10) {
          iVar102 = (int)uVar98 >> (6 - bVar97 & 0x1f);
          uVar104 = iVar101 - iVar102 >> (bVar97 & 0x1f);
          if ((int)uVar104 < 1) goto LAB_002e753e;
          uVar105 = (ulong)uVar104;
          if (0xf < uVar104) {
            uVar105 = 0x10;
          }
          auVar110 = *(undefined1 (*) [16])(left + iVar102);
          if (upsample_left == 0) {
            auVar320 = *(undefined1 (*) [16])(left + (long)iVar102 + 1);
            auVar324 = ZEXT416(uVar98 >> 1 & 0x1f);
            auVar324 = pshuflw(auVar324,auVar324,0);
            auVar324._4_4_ = auVar324._0_4_;
            auVar324._8_4_ = auVar324._0_4_;
            auVar324._12_4_ = auVar324._0_4_;
          }
          else {
            auVar110 = pshufb(auVar110,_DAT_00468e70);
            auVar320 = auVar110 >> 0x40;
            auVar324 = pshuflw(ZEXT416(uVar98),ZEXT416(uVar98),0);
            auVar362._0_4_ = auVar324._0_4_;
            auVar362._4_4_ = auVar362._0_4_;
            auVar362._8_4_ = auVar362._0_4_;
            auVar362._12_4_ = auVar362._0_4_;
            auVar324 = psllw(auVar362,ZEXT416((uint)upsample_left));
            auVar373._0_2_ = auVar324._0_2_ >> 1;
            auVar373._2_2_ = auVar324._2_2_ >> 1;
            auVar373._4_2_ = auVar324._4_2_ >> 1;
            auVar373._6_2_ = auVar324._6_2_ >> 1;
            auVar373._8_2_ = auVar324._8_2_ >> 1;
            auVar373._10_2_ = auVar324._10_2_ >> 1;
            auVar373._12_2_ = auVar324._12_2_ >> 1;
            auVar373._14_2_ = auVar324._14_2_ >> 1;
            auVar324 = auVar373 & auVar318;
          }
          auVar362 = pmovzxbw(in_XMM9,auVar110);
          auVar374 = pmovzxbw(in_XMM10,auVar320);
          auVar373 = psllw(auVar362,5);
          in_XMM10._0_2_ = (auVar374._0_2_ - auVar362._0_2_) * auVar324._0_2_;
          in_XMM10._2_2_ = (auVar374._2_2_ - auVar362._2_2_) * auVar324._2_2_;
          in_XMM10._4_2_ = (auVar374._4_2_ - auVar362._4_2_) * auVar324._4_2_;
          in_XMM10._6_2_ = (auVar374._6_2_ - auVar362._6_2_) * auVar324._6_2_;
          in_XMM10._8_2_ = (auVar374._8_2_ - auVar362._8_2_) * auVar324._8_2_;
          in_XMM10._10_2_ = (auVar374._10_2_ - auVar362._10_2_) * auVar324._10_2_;
          in_XMM10._12_2_ = (auVar374._12_2_ - auVar362._12_2_) * auVar324._12_2_;
          in_XMM10._14_2_ = (auVar374._14_2_ - auVar362._14_2_) * auVar324._14_2_;
          uVar361 = (ushort)(auVar373._0_2_ + auVar255._0_2_ + in_XMM10._0_2_) >> 5;
          uVar366 = (ushort)(auVar373._2_2_ + auVar255._2_2_ + in_XMM10._2_2_) >> 5;
          uVar367 = (ushort)(auVar373._4_2_ + auVar255._4_2_ + in_XMM10._4_2_) >> 5;
          uVar368 = (ushort)(auVar373._6_2_ + auVar255._6_2_ + in_XMM10._6_2_) >> 5;
          uVar369 = (ushort)(auVar373._8_2_ + auVar255._8_2_ + in_XMM10._8_2_) >> 5;
          uVar370 = (ushort)(auVar373._10_2_ + auVar255._10_2_ + in_XMM10._10_2_) >> 5;
          uVar371 = (ushort)(auVar373._12_2_ + auVar255._12_2_ + in_XMM10._12_2_) >> 5;
          uVar372 = (ushort)(auVar373._14_2_ + auVar255._14_2_ + in_XMM10._14_2_) >> 5;
          auVar374._0_2_ = CONCAT11(0,auVar110[8]);
          auVar374[2] = auVar110[9];
          auVar374[3] = 0;
          auVar374[4] = auVar110[10];
          auVar374[5] = 0;
          auVar374[6] = auVar110[0xb];
          auVar374[7] = 0;
          auVar374[8] = auVar110[0xc];
          auVar374[9] = 0;
          auVar374[10] = auVar110[0xd];
          auVar374[0xb] = 0;
          auVar374[0xc] = auVar110[0xe];
          auVar374[0xd] = 0;
          auVar374[0xe] = auVar110[0xf];
          auVar374[0xf] = 0;
          auVar362 = psllw(auVar374,5);
          uVar106 = (ushort)(auVar362._0_2_ + auVar255._0_2_ +
                            (auVar320[8] - auVar374._0_2_) * auVar324._0_2_) >> 5;
          uVar164 = (ushort)(auVar362._2_2_ + auVar255._2_2_ +
                            ((ushort)auVar320[9] - (ushort)auVar110[9]) * auVar324._2_2_) >> 5;
          uVar166 = (ushort)(auVar362._4_2_ + auVar255._4_2_ +
                            ((ushort)auVar320[10] - (ushort)auVar110[10]) * auVar324._4_2_) >> 5;
          uVar167 = (ushort)(auVar362._6_2_ + auVar255._6_2_ +
                            ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * auVar324._6_2_) >> 5;
          uVar168 = (ushort)(auVar362._8_2_ + auVar255._8_2_ +
                            ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * auVar324._8_2_) >> 5;
          uVar169 = (ushort)(auVar362._10_2_ + auVar255._10_2_ +
                            ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * auVar324._10_2_) >> 5;
          uVar170 = (ushort)(auVar362._12_2_ + auVar255._12_2_ +
                            ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * auVar324._12_2_) >> 5;
          uVar171 = (ushort)(auVar362._14_2_ + auVar255._14_2_ +
                            ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * auVar324._14_2_) >> 5;
          in_XMM9[1] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 - (0xff < uVar366);
          in_XMM9[0] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361);
          in_XMM9[2] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
          in_XMM9[3] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
          in_XMM9[4] = (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
          in_XMM9[5] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
          in_XMM9[6] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
          in_XMM9[7] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
          in_XMM9[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
          in_XMM9[9] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
          in_XMM9[10] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
          in_XMM9[0xb] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
          in_XMM9[0xc] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
          in_XMM9[0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
          in_XMM9[0xe] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
          in_XMM9[0xf] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
          auVar110 = pblendvb(auVar179,in_XMM9,(undefined1  [16])Mask[0][uVar105]);
          *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar110;
          uVar98 = uVar98 + dy;
        }
        goto LAB_002e7547;
      }
      if (bh == 8) {
        iVar101 = 0x27 << (bVar97 & 0x1f);
        auVar179 = pshufb(ZEXT116(left[iVar101]),(undefined1  [16])0x0);
        lVar99 = 0;
        auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
        auVar318 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
        uVar98 = dy;
        for (; lVar99 != 0x200; lVar99 = lVar99 + 0x10) {
          iVar102 = (int)uVar98 >> (6 - bVar97 & 0x1f);
          uVar104 = iVar101 - iVar102 >> (bVar97 & 0x1f);
          if ((int)uVar104 < 1) goto LAB_002e712b;
          uVar105 = (ulong)uVar104;
          if (7 < uVar104) {
            uVar105 = 8;
          }
          auVar110 = *(undefined1 (*) [16])(left + iVar102);
          if (upsample_left == 0) {
            auVar320 = *(undefined1 (*) [16])(left + (long)iVar102 + 1);
            auVar324 = ZEXT416(uVar98 >> 1 & 0x1f);
            auVar324 = pshuflw(auVar324,auVar324,0);
            auVar348._0_4_ = auVar324._0_4_;
            auVar348._4_4_ = auVar348._0_4_;
            auVar348._8_4_ = auVar348._0_4_;
            auVar348._12_4_ = auVar348._0_4_;
          }
          else {
            auVar110 = pshufb(auVar110,_DAT_00468e70);
            auVar320 = auVar110 >> 0x40;
            auVar324 = pshuflw(ZEXT416(uVar98),ZEXT416(uVar98),0);
            auVar346._0_4_ = auVar324._0_4_;
            auVar346._4_4_ = auVar346._0_4_;
            auVar346._8_4_ = auVar346._0_4_;
            auVar346._12_4_ = auVar346._0_4_;
            auVar324 = psllw(auVar346,ZEXT416((uint)upsample_left));
            auVar347._0_2_ = auVar324._0_2_ >> 1;
            auVar347._2_2_ = auVar324._2_2_ >> 1;
            auVar347._4_2_ = auVar324._4_2_ >> 1;
            auVar347._6_2_ = auVar324._6_2_ >> 1;
            auVar347._8_2_ = auVar324._8_2_ >> 1;
            auVar347._10_2_ = auVar324._10_2_ >> 1;
            auVar347._12_2_ = auVar324._12_2_ >> 1;
            auVar347._14_2_ = auVar324._14_2_ >> 1;
            auVar348 = auVar347 & auVar318;
          }
          auVar324 = pmovzxbw(in_XMM9,auVar110);
          auVar373 = pmovzxbw(in_XMM10,auVar320);
          auVar362 = psllw(auVar324,5);
          in_XMM10._0_2_ = (auVar373._0_2_ - auVar324._0_2_) * auVar348._0_2_;
          in_XMM10._2_2_ = (auVar373._2_2_ - auVar324._2_2_) * auVar348._2_2_;
          in_XMM10._4_2_ = (auVar373._4_2_ - auVar324._4_2_) * auVar348._4_2_;
          in_XMM10._6_2_ = (auVar373._6_2_ - auVar324._6_2_) * auVar348._6_2_;
          in_XMM10._8_2_ = (auVar373._8_2_ - auVar324._8_2_) * auVar348._8_2_;
          in_XMM10._10_2_ = (auVar373._10_2_ - auVar324._10_2_) * auVar348._10_2_;
          in_XMM10._12_2_ = (auVar373._12_2_ - auVar324._12_2_) * auVar348._12_2_;
          in_XMM10._14_2_ = (auVar373._14_2_ - auVar324._14_2_) * auVar348._14_2_;
          uVar361 = (ushort)(auVar362._0_2_ + auVar255._0_2_ + in_XMM10._0_2_) >> 5;
          uVar366 = (ushort)(auVar362._2_2_ + auVar255._2_2_ + in_XMM10._2_2_) >> 5;
          uVar367 = (ushort)(auVar362._4_2_ + auVar255._4_2_ + in_XMM10._4_2_) >> 5;
          uVar368 = (ushort)(auVar362._6_2_ + auVar255._6_2_ + in_XMM10._6_2_) >> 5;
          uVar369 = (ushort)(auVar362._8_2_ + auVar255._8_2_ + in_XMM10._8_2_) >> 5;
          uVar370 = (ushort)(auVar362._10_2_ + auVar255._10_2_ + in_XMM10._10_2_) >> 5;
          uVar371 = (ushort)(auVar362._12_2_ + auVar255._12_2_ + in_XMM10._12_2_) >> 5;
          uVar372 = (ushort)(auVar362._14_2_ + auVar255._14_2_ + in_XMM10._14_2_) >> 5;
          auVar159._0_2_ = CONCAT11(0,auVar110[8]);
          auVar159[2] = auVar110[9];
          auVar159[3] = 0;
          auVar159[4] = auVar110[10];
          auVar159[5] = 0;
          auVar159[6] = auVar110[0xb];
          auVar159[7] = 0;
          auVar159[8] = auVar110[0xc];
          auVar159[9] = 0;
          auVar159[10] = auVar110[0xd];
          auVar159[0xb] = 0;
          auVar159[0xc] = auVar110[0xe];
          auVar159[0xd] = 0;
          auVar159[0xe] = auVar110[0xf];
          auVar159[0xf] = 0;
          auVar324 = psllw(auVar159,5);
          uVar106 = (ushort)(auVar324._0_2_ + auVar255._0_2_ +
                            (auVar320[8] - auVar159._0_2_) * auVar348._0_2_) >> 5;
          uVar164 = (ushort)(auVar324._2_2_ + auVar255._2_2_ +
                            ((ushort)auVar320[9] - (ushort)auVar110[9]) * auVar348._2_2_) >> 5;
          uVar166 = (ushort)(auVar324._4_2_ + auVar255._4_2_ +
                            ((ushort)auVar320[10] - (ushort)auVar110[10]) * auVar348._4_2_) >> 5;
          uVar167 = (ushort)(auVar324._6_2_ + auVar255._6_2_ +
                            ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * auVar348._6_2_) >> 5;
          uVar168 = (ushort)(auVar324._8_2_ + auVar255._8_2_ +
                            ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * auVar348._8_2_) >> 5;
          uVar169 = (ushort)(auVar324._10_2_ + auVar255._10_2_ +
                            ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * auVar348._10_2_) >> 5;
          uVar170 = (ushort)(auVar324._12_2_ + auVar255._12_2_ +
                            ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * auVar348._12_2_) >> 5;
          uVar171 = (ushort)(auVar324._14_2_ + auVar255._14_2_ +
                            ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * auVar348._14_2_) >> 5;
          in_XMM9[1] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 - (0xff < uVar366);
          in_XMM9[0] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361);
          in_XMM9[2] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
          in_XMM9[3] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
          in_XMM9[4] = (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
          in_XMM9[5] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
          in_XMM9[6] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
          in_XMM9[7] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
          in_XMM9[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
          in_XMM9[9] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
          in_XMM9[10] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
          in_XMM9[0xb] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
          in_XMM9[0xc] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
          in_XMM9[0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
          in_XMM9[0xe] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
          in_XMM9[0xf] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
          auVar110 = pblendvb(auVar179,in_XMM9,(undefined1  [16])Mask[0][uVar105]);
          *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar110;
          uVar98 = uVar98 + dy;
        }
        goto LAB_002e7134;
      }
      if (bh != 4) {
        return;
      }
      iVar101 = 0x13 << (bVar97 & 0x1f);
      auVar179 = pshufb(ZEXT116(left[iVar101]),(undefined1  [16])0x0);
      lVar99 = 0;
      auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar318 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar98 = dy;
      for (; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
        iVar102 = (int)uVar98 >> (6 - bVar97 & 0x1f);
        uVar104 = iVar101 - iVar102 >> (bVar97 & 0x1f);
        if ((int)uVar104 < 1) goto LAB_002e67b1;
        uVar105 = (ulong)uVar104;
        if (3 < uVar104) {
          uVar105 = 4;
        }
        auVar110 = *(undefined1 (*) [16])(left + iVar102);
        if (upsample_left == 0) {
          auVar320 = *(undefined1 (*) [16])(left + (long)iVar102 + 1);
          auVar324 = ZEXT416(uVar98 >> 1 & 0x1f);
          auVar324 = pshuflw(auVar324,auVar324,0);
          auVar339._0_4_ = auVar324._0_4_;
          auVar339._4_4_ = auVar339._0_4_;
          auVar339._8_4_ = auVar339._0_4_;
          auVar339._12_4_ = auVar339._0_4_;
        }
        else {
          auVar110 = pshufb(auVar110,_DAT_00468e70);
          auVar320 = auVar110 >> 0x40;
          auVar324 = pshuflw(ZEXT416(uVar98),ZEXT416(uVar98),0);
          auVar337._0_4_ = auVar324._0_4_;
          auVar337._4_4_ = auVar337._0_4_;
          auVar337._8_4_ = auVar337._0_4_;
          auVar337._12_4_ = auVar337._0_4_;
          auVar324 = psllw(auVar337,ZEXT416((uint)upsample_left));
          auVar338._0_2_ = auVar324._0_2_ >> 1;
          auVar338._2_2_ = auVar324._2_2_ >> 1;
          auVar338._4_2_ = auVar324._4_2_ >> 1;
          auVar338._6_2_ = auVar324._6_2_ >> 1;
          auVar338._8_2_ = auVar324._8_2_ >> 1;
          auVar338._10_2_ = auVar324._10_2_ >> 1;
          auVar338._12_2_ = auVar324._12_2_ >> 1;
          auVar338._14_2_ = auVar324._14_2_ >> 1;
          auVar339 = auVar338 & auVar318;
        }
        auVar324 = pmovzxbw(in_XMM9,auVar110);
        auVar373 = pmovzxbw(in_XMM10,auVar320);
        auVar362 = psllw(auVar324,5);
        in_XMM10._0_2_ = (auVar373._0_2_ - auVar324._0_2_) * auVar339._0_2_;
        in_XMM10._2_2_ = (auVar373._2_2_ - auVar324._2_2_) * auVar339._2_2_;
        in_XMM10._4_2_ = (auVar373._4_2_ - auVar324._4_2_) * auVar339._4_2_;
        in_XMM10._6_2_ = (auVar373._6_2_ - auVar324._6_2_) * auVar339._6_2_;
        in_XMM10._8_2_ = (auVar373._8_2_ - auVar324._8_2_) * auVar339._8_2_;
        in_XMM10._10_2_ = (auVar373._10_2_ - auVar324._10_2_) * auVar339._10_2_;
        in_XMM10._12_2_ = (auVar373._12_2_ - auVar324._12_2_) * auVar339._12_2_;
        in_XMM10._14_2_ = (auVar373._14_2_ - auVar324._14_2_) * auVar339._14_2_;
        uVar361 = (ushort)(auVar362._0_2_ + auVar255._0_2_ + in_XMM10._0_2_) >> 5;
        uVar366 = (ushort)(auVar362._2_2_ + auVar255._2_2_ + in_XMM10._2_2_) >> 5;
        uVar367 = (ushort)(auVar362._4_2_ + auVar255._4_2_ + in_XMM10._4_2_) >> 5;
        uVar368 = (ushort)(auVar362._6_2_ + auVar255._6_2_ + in_XMM10._6_2_) >> 5;
        uVar369 = (ushort)(auVar362._8_2_ + auVar255._8_2_ + in_XMM10._8_2_) >> 5;
        uVar370 = (ushort)(auVar362._10_2_ + auVar255._10_2_ + in_XMM10._10_2_) >> 5;
        uVar371 = (ushort)(auVar362._12_2_ + auVar255._12_2_ + in_XMM10._12_2_) >> 5;
        uVar372 = (ushort)(auVar362._14_2_ + auVar255._14_2_ + in_XMM10._14_2_) >> 5;
        auVar147._0_2_ = CONCAT11(0,auVar110[8]);
        auVar147[2] = auVar110[9];
        auVar147[3] = 0;
        auVar147[4] = auVar110[10];
        auVar147[5] = 0;
        auVar147[6] = auVar110[0xb];
        auVar147[7] = 0;
        auVar147[8] = auVar110[0xc];
        auVar147[9] = 0;
        auVar147[10] = auVar110[0xd];
        auVar147[0xb] = 0;
        auVar147[0xc] = auVar110[0xe];
        auVar147[0xd] = 0;
        auVar147[0xe] = auVar110[0xf];
        auVar147[0xf] = 0;
        auVar324 = psllw(auVar147,5);
        uVar106 = (ushort)(auVar324._0_2_ + auVar255._0_2_ +
                          (auVar320[8] - auVar147._0_2_) * auVar339._0_2_) >> 5;
        uVar164 = (ushort)(auVar324._2_2_ + auVar255._2_2_ +
                          ((ushort)auVar320[9] - (ushort)auVar110[9]) * auVar339._2_2_) >> 5;
        uVar166 = (ushort)(auVar324._4_2_ + auVar255._4_2_ +
                          ((ushort)auVar320[10] - (ushort)auVar110[10]) * auVar339._4_2_) >> 5;
        uVar167 = (ushort)(auVar324._6_2_ + auVar255._6_2_ +
                          ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * auVar339._6_2_) >> 5;
        uVar168 = (ushort)(auVar324._8_2_ + auVar255._8_2_ +
                          ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * auVar339._8_2_) >> 5;
        uVar169 = (ushort)(auVar324._10_2_ + auVar255._10_2_ +
                          ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * auVar339._10_2_) >> 5;
        uVar170 = (ushort)(auVar324._12_2_ + auVar255._12_2_ +
                          ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * auVar339._12_2_) >> 5;
        uVar171 = (ushort)(auVar324._14_2_ + auVar255._14_2_ +
                          ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * auVar339._14_2_) >> 5;
        in_XMM9[1] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 - (0xff < uVar366);
        in_XMM9[0] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361);
        in_XMM9[2] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
        in_XMM9[3] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
        in_XMM9[4] = (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
        in_XMM9[5] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
        in_XMM9[6] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
        in_XMM9[7] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
        in_XMM9[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
        in_XMM9[9] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
        in_XMM9[10] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
        in_XMM9[0xb] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
        in_XMM9[0xc] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
        in_XMM9[0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
        in_XMM9[0xe] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
        in_XMM9[0xf] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
        auVar110 = pblendvb(auVar179,in_XMM9,(undefined1  [16])Mask[0][uVar105]);
        *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar110;
        uVar98 = uVar98 + dy;
      }
      goto LAB_002e67ba;
    }
    switch(bh << 0x1e | bh - 4U >> 2) {
    case 0:
      iVar101 = 0xb << (bVar97 & 0x1f);
      auVar179 = pshufb(ZEXT116(left[iVar101]),(undefined1  [16])0x0);
      lVar99 = 0;
      auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar318 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar98 = dy;
      while( true ) {
        if (lVar99 == 0x80) break;
        iVar102 = (int)uVar98 >> (6 - bVar97 & 0x1f);
        uVar104 = iVar101 - iVar102 >> (bVar97 & 0x1f);
        if ((int)uVar104 < 1) goto LAB_002e62a5;
        uVar105 = (ulong)uVar104;
        if (3 < uVar104) {
          uVar105 = 4;
        }
        auVar110 = *(undefined1 (*) [16])(left + iVar102);
        if (upsample_left == 0) {
          auVar320 = *(undefined1 (*) [16])(left + (long)iVar102 + 1);
          auVar324 = ZEXT416(uVar98 >> 1 & 0x1f);
          auVar324 = pshuflw(auVar324,auVar324,0);
          auVar333._0_4_ = auVar324._0_4_;
          auVar333._4_4_ = auVar333._0_4_;
          auVar333._8_4_ = auVar333._0_4_;
          auVar333._12_4_ = auVar333._0_4_;
        }
        else {
          auVar110 = pshufb(auVar110,_DAT_00468e70);
          auVar320 = auVar110 >> 0x40;
          auVar324 = pshuflw(ZEXT416(uVar98),ZEXT416(uVar98),0);
          auVar331._0_4_ = auVar324._0_4_;
          auVar331._4_4_ = auVar331._0_4_;
          auVar331._8_4_ = auVar331._0_4_;
          auVar331._12_4_ = auVar331._0_4_;
          auVar324 = psllw(auVar331,ZEXT416((uint)upsample_left));
          auVar332._0_2_ = auVar324._0_2_ >> 1;
          auVar332._2_2_ = auVar324._2_2_ >> 1;
          auVar332._4_2_ = auVar324._4_2_ >> 1;
          auVar332._6_2_ = auVar324._6_2_ >> 1;
          auVar332._8_2_ = auVar324._8_2_ >> 1;
          auVar332._10_2_ = auVar324._10_2_ >> 1;
          auVar332._12_2_ = auVar324._12_2_ >> 1;
          auVar332._14_2_ = auVar324._14_2_ >> 1;
          auVar333 = auVar332 & auVar318;
        }
        auVar324 = pmovzxbw(in_XMM9,auVar110);
        auVar373 = pmovzxbw(in_XMM10,auVar320);
        auVar362 = psllw(auVar324,5);
        in_XMM10._0_2_ = (auVar373._0_2_ - auVar324._0_2_) * auVar333._0_2_;
        in_XMM10._2_2_ = (auVar373._2_2_ - auVar324._2_2_) * auVar333._2_2_;
        in_XMM10._4_2_ = (auVar373._4_2_ - auVar324._4_2_) * auVar333._4_2_;
        in_XMM10._6_2_ = (auVar373._6_2_ - auVar324._6_2_) * auVar333._6_2_;
        in_XMM10._8_2_ = (auVar373._8_2_ - auVar324._8_2_) * auVar333._8_2_;
        in_XMM10._10_2_ = (auVar373._10_2_ - auVar324._10_2_) * auVar333._10_2_;
        in_XMM10._12_2_ = (auVar373._12_2_ - auVar324._12_2_) * auVar333._12_2_;
        in_XMM10._14_2_ = (auVar373._14_2_ - auVar324._14_2_) * auVar333._14_2_;
        uVar361 = (ushort)(auVar362._0_2_ + auVar255._0_2_ + in_XMM10._0_2_) >> 5;
        uVar366 = (ushort)(auVar362._2_2_ + auVar255._2_2_ + in_XMM10._2_2_) >> 5;
        uVar367 = (ushort)(auVar362._4_2_ + auVar255._4_2_ + in_XMM10._4_2_) >> 5;
        uVar368 = (ushort)(auVar362._6_2_ + auVar255._6_2_ + in_XMM10._6_2_) >> 5;
        uVar369 = (ushort)(auVar362._8_2_ + auVar255._8_2_ + in_XMM10._8_2_) >> 5;
        uVar370 = (ushort)(auVar362._10_2_ + auVar255._10_2_ + in_XMM10._10_2_) >> 5;
        uVar371 = (ushort)(auVar362._12_2_ + auVar255._12_2_ + in_XMM10._12_2_) >> 5;
        uVar372 = (ushort)(auVar362._14_2_ + auVar255._14_2_ + in_XMM10._14_2_) >> 5;
        auVar132._0_2_ = CONCAT11(0,auVar110[8]);
        auVar132[2] = auVar110[9];
        auVar132[3] = 0;
        auVar132[4] = auVar110[10];
        auVar132[5] = 0;
        auVar132[6] = auVar110[0xb];
        auVar132[7] = 0;
        auVar132[8] = auVar110[0xc];
        auVar132[9] = 0;
        auVar132[10] = auVar110[0xd];
        auVar132[0xb] = 0;
        auVar132[0xc] = auVar110[0xe];
        auVar132[0xd] = 0;
        auVar132[0xe] = auVar110[0xf];
        auVar132[0xf] = 0;
        auVar324 = psllw(auVar132,5);
        uVar106 = (ushort)(auVar324._0_2_ + auVar255._0_2_ +
                          (auVar320[8] - auVar132._0_2_) * auVar333._0_2_) >> 5;
        uVar164 = (ushort)(auVar324._2_2_ + auVar255._2_2_ +
                          ((ushort)auVar320[9] - (ushort)auVar110[9]) * auVar333._2_2_) >> 5;
        uVar166 = (ushort)(auVar324._4_2_ + auVar255._4_2_ +
                          ((ushort)auVar320[10] - (ushort)auVar110[10]) * auVar333._4_2_) >> 5;
        uVar167 = (ushort)(auVar324._6_2_ + auVar255._6_2_ +
                          ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * auVar333._6_2_) >> 5;
        uVar168 = (ushort)(auVar324._8_2_ + auVar255._8_2_ +
                          ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * auVar333._8_2_) >> 5;
        uVar169 = (ushort)(auVar324._10_2_ + auVar255._10_2_ +
                          ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * auVar333._10_2_) >> 5;
        uVar170 = (ushort)(auVar324._12_2_ + auVar255._12_2_ +
                          ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * auVar333._12_2_) >> 5;
        uVar171 = (ushort)(auVar324._14_2_ + auVar255._14_2_ +
                          ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * auVar333._14_2_) >> 5;
        in_XMM9[1] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 - (0xff < uVar366);
        in_XMM9[0] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361);
        in_XMM9[2] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
        in_XMM9[3] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
        in_XMM9[4] = (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
        in_XMM9[5] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
        in_XMM9[6] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
        in_XMM9[7] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
        in_XMM9[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
        in_XMM9[9] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
        in_XMM9[10] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
        in_XMM9[0xb] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
        in_XMM9[0xc] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
        in_XMM9[0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
        in_XMM9[0xe] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
        in_XMM9[0xf] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
        auVar110 = pblendvb(auVar179,in_XMM9,(undefined1  [16])Mask[0][uVar105]);
        *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar110;
        uVar98 = uVar98 + dy;
        lVar99 = lVar99 + 0x10;
      }
      break;
    case 1:
      iVar101 = 0x17 << (bVar97 & 0x1f);
      auVar179 = pshufb(ZEXT116(left[iVar101]),(undefined1  [16])0x0);
      lVar99 = 0;
      auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar318 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar98 = dy;
      for (; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
        iVar102 = (int)uVar98 >> (6 - bVar97 & 0x1f);
        uVar104 = iVar101 - iVar102 >> (bVar97 & 0x1f);
        if ((int)uVar104 < 1) goto LAB_002e7e8b;
        uVar105 = (ulong)uVar104;
        if (7 < uVar104) {
          uVar105 = 8;
        }
        auVar110 = *(undefined1 (*) [16])(left + iVar102);
        if (upsample_left == 0) {
          auVar320 = *(undefined1 (*) [16])(left + (long)iVar102 + 1);
          auVar324 = ZEXT416(uVar98 >> 1 & 0x1f);
          auVar324 = pshuflw(auVar324,auVar324,0);
          auVar360._0_4_ = auVar324._0_4_;
          auVar360._4_4_ = auVar360._0_4_;
          auVar360._8_4_ = auVar360._0_4_;
          auVar360._12_4_ = auVar360._0_4_;
        }
        else {
          auVar110 = pshufb(auVar110,_DAT_00468e70);
          auVar320 = auVar110 >> 0x40;
          auVar324 = pshuflw(ZEXT416(uVar98),ZEXT416(uVar98),0);
          auVar358._0_4_ = auVar324._0_4_;
          auVar358._4_4_ = auVar358._0_4_;
          auVar358._8_4_ = auVar358._0_4_;
          auVar358._12_4_ = auVar358._0_4_;
          auVar324 = psllw(auVar358,ZEXT416((uint)upsample_left));
          auVar359._0_2_ = auVar324._0_2_ >> 1;
          auVar359._2_2_ = auVar324._2_2_ >> 1;
          auVar359._4_2_ = auVar324._4_2_ >> 1;
          auVar359._6_2_ = auVar324._6_2_ >> 1;
          auVar359._8_2_ = auVar324._8_2_ >> 1;
          auVar359._10_2_ = auVar324._10_2_ >> 1;
          auVar359._12_2_ = auVar324._12_2_ >> 1;
          auVar359._14_2_ = auVar324._14_2_ >> 1;
          auVar360 = auVar359 & auVar318;
        }
        auVar324 = pmovzxbw(in_XMM9,auVar110);
        auVar373 = pmovzxbw(in_XMM10,auVar320);
        auVar362 = psllw(auVar324,5);
        in_XMM10._0_2_ = (auVar373._0_2_ - auVar324._0_2_) * auVar360._0_2_;
        in_XMM10._2_2_ = (auVar373._2_2_ - auVar324._2_2_) * auVar360._2_2_;
        in_XMM10._4_2_ = (auVar373._4_2_ - auVar324._4_2_) * auVar360._4_2_;
        in_XMM10._6_2_ = (auVar373._6_2_ - auVar324._6_2_) * auVar360._6_2_;
        in_XMM10._8_2_ = (auVar373._8_2_ - auVar324._8_2_) * auVar360._8_2_;
        in_XMM10._10_2_ = (auVar373._10_2_ - auVar324._10_2_) * auVar360._10_2_;
        in_XMM10._12_2_ = (auVar373._12_2_ - auVar324._12_2_) * auVar360._12_2_;
        in_XMM10._14_2_ = (auVar373._14_2_ - auVar324._14_2_) * auVar360._14_2_;
        uVar361 = (ushort)(auVar362._0_2_ + auVar255._0_2_ + in_XMM10._0_2_) >> 5;
        uVar366 = (ushort)(auVar362._2_2_ + auVar255._2_2_ + in_XMM10._2_2_) >> 5;
        uVar367 = (ushort)(auVar362._4_2_ + auVar255._4_2_ + in_XMM10._4_2_) >> 5;
        uVar368 = (ushort)(auVar362._6_2_ + auVar255._6_2_ + in_XMM10._6_2_) >> 5;
        uVar369 = (ushort)(auVar362._8_2_ + auVar255._8_2_ + in_XMM10._8_2_) >> 5;
        uVar370 = (ushort)(auVar362._10_2_ + auVar255._10_2_ + in_XMM10._10_2_) >> 5;
        uVar371 = (ushort)(auVar362._12_2_ + auVar255._12_2_ + in_XMM10._12_2_) >> 5;
        uVar372 = (ushort)(auVar362._14_2_ + auVar255._14_2_ + in_XMM10._14_2_) >> 5;
        auVar163._0_2_ = CONCAT11(0,auVar110[8]);
        auVar163[2] = auVar110[9];
        auVar163[3] = 0;
        auVar163[4] = auVar110[10];
        auVar163[5] = 0;
        auVar163[6] = auVar110[0xb];
        auVar163[7] = 0;
        auVar163[8] = auVar110[0xc];
        auVar163[9] = 0;
        auVar163[10] = auVar110[0xd];
        auVar163[0xb] = 0;
        auVar163[0xc] = auVar110[0xe];
        auVar163[0xd] = 0;
        auVar163[0xe] = auVar110[0xf];
        auVar163[0xf] = 0;
        auVar324 = psllw(auVar163,5);
        uVar106 = (ushort)(auVar324._0_2_ + auVar255._0_2_ +
                          (auVar320[8] - auVar163._0_2_) * auVar360._0_2_) >> 5;
        uVar164 = (ushort)(auVar324._2_2_ + auVar255._2_2_ +
                          ((ushort)auVar320[9] - (ushort)auVar110[9]) * auVar360._2_2_) >> 5;
        uVar166 = (ushort)(auVar324._4_2_ + auVar255._4_2_ +
                          ((ushort)auVar320[10] - (ushort)auVar110[10]) * auVar360._4_2_) >> 5;
        uVar167 = (ushort)(auVar324._6_2_ + auVar255._6_2_ +
                          ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * auVar360._6_2_) >> 5;
        uVar168 = (ushort)(auVar324._8_2_ + auVar255._8_2_ +
                          ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * auVar360._8_2_) >> 5;
        uVar169 = (ushort)(auVar324._10_2_ + auVar255._10_2_ +
                          ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * auVar360._10_2_) >> 5;
        uVar170 = (ushort)(auVar324._12_2_ + auVar255._12_2_ +
                          ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * auVar360._12_2_) >> 5;
        uVar171 = (ushort)(auVar324._14_2_ + auVar255._14_2_ +
                          ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * auVar360._14_2_) >> 5;
        in_XMM9[1] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 - (0xff < uVar366);
        in_XMM9[0] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361);
        in_XMM9[2] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
        in_XMM9[3] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
        in_XMM9[4] = (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
        in_XMM9[5] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
        in_XMM9[6] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
        in_XMM9[7] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
        in_XMM9[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
        in_XMM9[9] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
        in_XMM9[10] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
        in_XMM9[0xb] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
        in_XMM9[0xc] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
        in_XMM9[0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
        in_XMM9[0xe] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
        in_XMM9[0xf] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
        auVar110 = pblendvb(auVar179,in_XMM9,(undefined1  [16])Mask[0][uVar105]);
        *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar110;
        uVar98 = uVar98 + dy;
      }
      goto LAB_002e7e94;
    default:
      return;
    case 3:
      iVar101 = 0x2f << (bVar97 & 0x1f);
      auVar179 = pshufb(ZEXT116(left[iVar101]),(undefined1  [16])0x0);
      lVar99 = 0;
      auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar318 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar98 = dy;
      for (; lVar99 != 0x200; lVar99 = lVar99 + 0x10) {
        iVar102 = (int)uVar98 >> (6 - bVar97 & 0x1f);
        uVar104 = iVar101 - iVar102 >> (bVar97 & 0x1f);
        if ((int)uVar104 < 1) goto LAB_002e79c5;
        uVar105 = (ulong)uVar104;
        if (0xf < uVar104) {
          uVar105 = 0x10;
        }
        auVar110 = *(undefined1 (*) [16])(left + iVar102);
        if (upsample_left == 0) {
          auVar320 = *(undefined1 (*) [16])(left + (long)iVar102 + 1);
          auVar324 = ZEXT416(uVar98 >> 1 & 0x1f);
          auVar324 = pshuflw(auVar324,auVar324,0);
          auVar351._0_4_ = auVar324._0_4_;
          auVar351._4_4_ = auVar351._0_4_;
          auVar351._8_4_ = auVar351._0_4_;
          auVar351._12_4_ = auVar351._0_4_;
        }
        else {
          auVar110 = pshufb(auVar110,_DAT_00468e70);
          auVar320 = auVar110 >> 0x40;
          auVar324 = pshuflw(ZEXT416(uVar98),ZEXT416(uVar98),0);
          auVar349._0_4_ = auVar324._0_4_;
          auVar349._4_4_ = auVar349._0_4_;
          auVar349._8_4_ = auVar349._0_4_;
          auVar349._12_4_ = auVar349._0_4_;
          auVar324 = psllw(auVar349,ZEXT416((uint)upsample_left));
          auVar350._0_2_ = auVar324._0_2_ >> 1;
          auVar350._2_2_ = auVar324._2_2_ >> 1;
          auVar350._4_2_ = auVar324._4_2_ >> 1;
          auVar350._6_2_ = auVar324._6_2_ >> 1;
          auVar350._8_2_ = auVar324._8_2_ >> 1;
          auVar350._10_2_ = auVar324._10_2_ >> 1;
          auVar350._12_2_ = auVar324._12_2_ >> 1;
          auVar350._14_2_ = auVar324._14_2_ >> 1;
          auVar351 = auVar350 & auVar318;
        }
        auVar324 = pmovzxbw(in_XMM9,auVar110);
        auVar373 = pmovzxbw(in_XMM10,auVar320);
        auVar362 = psllw(auVar324,5);
        in_XMM10._0_2_ = (auVar373._0_2_ - auVar324._0_2_) * auVar351._0_2_;
        in_XMM10._2_2_ = (auVar373._2_2_ - auVar324._2_2_) * auVar351._2_2_;
        in_XMM10._4_2_ = (auVar373._4_2_ - auVar324._4_2_) * auVar351._4_2_;
        in_XMM10._6_2_ = (auVar373._6_2_ - auVar324._6_2_) * auVar351._6_2_;
        in_XMM10._8_2_ = (auVar373._8_2_ - auVar324._8_2_) * auVar351._8_2_;
        in_XMM10._10_2_ = (auVar373._10_2_ - auVar324._10_2_) * auVar351._10_2_;
        in_XMM10._12_2_ = (auVar373._12_2_ - auVar324._12_2_) * auVar351._12_2_;
        in_XMM10._14_2_ = (auVar373._14_2_ - auVar324._14_2_) * auVar351._14_2_;
        uVar361 = (ushort)(auVar362._0_2_ + auVar255._0_2_ + in_XMM10._0_2_) >> 5;
        uVar366 = (ushort)(auVar362._2_2_ + auVar255._2_2_ + in_XMM10._2_2_) >> 5;
        uVar367 = (ushort)(auVar362._4_2_ + auVar255._4_2_ + in_XMM10._4_2_) >> 5;
        uVar368 = (ushort)(auVar362._6_2_ + auVar255._6_2_ + in_XMM10._6_2_) >> 5;
        uVar369 = (ushort)(auVar362._8_2_ + auVar255._8_2_ + in_XMM10._8_2_) >> 5;
        uVar370 = (ushort)(auVar362._10_2_ + auVar255._10_2_ + in_XMM10._10_2_) >> 5;
        uVar371 = (ushort)(auVar362._12_2_ + auVar255._12_2_ + in_XMM10._12_2_) >> 5;
        uVar372 = (ushort)(auVar362._14_2_ + auVar255._14_2_ + in_XMM10._14_2_) >> 5;
        auVar160._0_2_ = CONCAT11(0,auVar110[8]);
        auVar160[2] = auVar110[9];
        auVar160[3] = 0;
        auVar160[4] = auVar110[10];
        auVar160[5] = 0;
        auVar160[6] = auVar110[0xb];
        auVar160[7] = 0;
        auVar160[8] = auVar110[0xc];
        auVar160[9] = 0;
        auVar160[10] = auVar110[0xd];
        auVar160[0xb] = 0;
        auVar160[0xc] = auVar110[0xe];
        auVar160[0xd] = 0;
        auVar160[0xe] = auVar110[0xf];
        auVar160[0xf] = 0;
        auVar324 = psllw(auVar160,5);
        uVar106 = (ushort)(auVar324._0_2_ + auVar255._0_2_ +
                          (auVar320[8] - auVar160._0_2_) * auVar351._0_2_) >> 5;
        uVar164 = (ushort)(auVar324._2_2_ + auVar255._2_2_ +
                          ((ushort)auVar320[9] - (ushort)auVar110[9]) * auVar351._2_2_) >> 5;
        uVar166 = (ushort)(auVar324._4_2_ + auVar255._4_2_ +
                          ((ushort)auVar320[10] - (ushort)auVar110[10]) * auVar351._4_2_) >> 5;
        uVar167 = (ushort)(auVar324._6_2_ + auVar255._6_2_ +
                          ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * auVar351._6_2_) >> 5;
        uVar168 = (ushort)(auVar324._8_2_ + auVar255._8_2_ +
                          ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * auVar351._8_2_) >> 5;
        uVar169 = (ushort)(auVar324._10_2_ + auVar255._10_2_ +
                          ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * auVar351._10_2_) >> 5;
        uVar170 = (ushort)(auVar324._12_2_ + auVar255._12_2_ +
                          ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * auVar351._12_2_) >> 5;
        uVar171 = (ushort)(auVar324._14_2_ + auVar255._14_2_ +
                          ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * auVar351._14_2_) >> 5;
        in_XMM9[1] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 - (0xff < uVar366);
        in_XMM9[0] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361);
        in_XMM9[2] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
        in_XMM9[3] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
        in_XMM9[4] = (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
        in_XMM9[5] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
        in_XMM9[6] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
        in_XMM9[7] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
        in_XMM9[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
        in_XMM9[9] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
        in_XMM9[10] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
        in_XMM9[0xb] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
        in_XMM9[0xc] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
        in_XMM9[0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
        in_XMM9[0xe] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
        in_XMM9[0xf] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
        auVar110 = pblendvb(auVar179,in_XMM9,(undefined1  [16])Mask[0][uVar105]);
        *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar110;
        uVar98 = uVar98 + dy;
      }
      goto LAB_002e79ce;
    case 7:
      iVar102 = 0x40;
      pitchSrc = 0x20;
      dr_prediction_z1_32xN_sse4_1(0x40,(uint8_t *)dstvec,0x20,left,dy,iVar101);
      iVar101 = 0x20;
      goto LAB_002e7fd8;
    }
    goto LAB_002e62ae;
  }
  if (bw == 0x40) {
    pitchSrc = 0x40;
    iVar102 = 0x40;
    dr_prediction_z1_64xN_sse4_1(0x40,(uint8_t *)dstvec,0x40,left,dy,iVar101);
    iVar101 = iVar102;
LAB_002e7fd8:
    transpose((uint8_t *)dstvec,pitchSrc,dst,stride,iVar102,iVar101);
    return;
  }
  if (bw != 8) {
    if (bw == 0x10) {
      iVar101 = 0x1f << (bVar97 & 0x1f);
      auVar179 = pshufb(ZEXT116(left[iVar101]),(undefined1  [16])0x0);
      lVar99 = 0;
      auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar318 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar98 = dy;
      for (; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
        iVar102 = (int)uVar98 >> (6 - bVar97 & 0x1f);
        uVar104 = iVar101 - iVar102 >> (bVar97 & 0x1f);
        if ((int)uVar104 < 1) goto LAB_002e6db3;
        uVar105 = (ulong)uVar104;
        if (0xf < uVar104) {
          uVar105 = 0x10;
        }
        auVar110 = *(undefined1 (*) [16])(left + iVar102);
        if (upsample_left == 0) {
          auVar320 = *(undefined1 (*) [16])(left + (long)iVar102 + 1);
          auVar324 = ZEXT416(uVar98 >> 1 & 0x1f);
          auVar324 = pshuflw(auVar324,auVar324,0);
          auVar345._0_4_ = auVar324._0_4_;
          auVar345._4_4_ = auVar345._0_4_;
          auVar345._8_4_ = auVar345._0_4_;
          auVar345._12_4_ = auVar345._0_4_;
        }
        else {
          auVar110 = pshufb(auVar110,_DAT_00468e70);
          auVar320 = auVar110 >> 0x40;
          auVar324 = pshuflw(ZEXT416(uVar98),ZEXT416(uVar98),0);
          auVar343._0_4_ = auVar324._0_4_;
          auVar343._4_4_ = auVar343._0_4_;
          auVar343._8_4_ = auVar343._0_4_;
          auVar343._12_4_ = auVar343._0_4_;
          auVar324 = psllw(auVar343,ZEXT416((uint)upsample_left));
          auVar344._0_2_ = auVar324._0_2_ >> 1;
          auVar344._2_2_ = auVar324._2_2_ >> 1;
          auVar344._4_2_ = auVar324._4_2_ >> 1;
          auVar344._6_2_ = auVar324._6_2_ >> 1;
          auVar344._8_2_ = auVar324._8_2_ >> 1;
          auVar344._10_2_ = auVar324._10_2_ >> 1;
          auVar344._12_2_ = auVar324._12_2_ >> 1;
          auVar344._14_2_ = auVar324._14_2_ >> 1;
          auVar345 = auVar344 & auVar318;
        }
        auVar324 = pmovzxbw(in_XMM9,auVar110);
        auVar373 = pmovzxbw(in_XMM10,auVar320);
        auVar362 = psllw(auVar324,5);
        in_XMM10._0_2_ = (auVar373._0_2_ - auVar324._0_2_) * auVar345._0_2_;
        in_XMM10._2_2_ = (auVar373._2_2_ - auVar324._2_2_) * auVar345._2_2_;
        in_XMM10._4_2_ = (auVar373._4_2_ - auVar324._4_2_) * auVar345._4_2_;
        in_XMM10._6_2_ = (auVar373._6_2_ - auVar324._6_2_) * auVar345._6_2_;
        in_XMM10._8_2_ = (auVar373._8_2_ - auVar324._8_2_) * auVar345._8_2_;
        in_XMM10._10_2_ = (auVar373._10_2_ - auVar324._10_2_) * auVar345._10_2_;
        in_XMM10._12_2_ = (auVar373._12_2_ - auVar324._12_2_) * auVar345._12_2_;
        in_XMM10._14_2_ = (auVar373._14_2_ - auVar324._14_2_) * auVar345._14_2_;
        uVar361 = (ushort)(auVar362._0_2_ + auVar255._0_2_ + in_XMM10._0_2_) >> 5;
        uVar366 = (ushort)(auVar362._2_2_ + auVar255._2_2_ + in_XMM10._2_2_) >> 5;
        uVar367 = (ushort)(auVar362._4_2_ + auVar255._4_2_ + in_XMM10._4_2_) >> 5;
        uVar368 = (ushort)(auVar362._6_2_ + auVar255._6_2_ + in_XMM10._6_2_) >> 5;
        uVar369 = (ushort)(auVar362._8_2_ + auVar255._8_2_ + in_XMM10._8_2_) >> 5;
        uVar370 = (ushort)(auVar362._10_2_ + auVar255._10_2_ + in_XMM10._10_2_) >> 5;
        uVar371 = (ushort)(auVar362._12_2_ + auVar255._12_2_ + in_XMM10._12_2_) >> 5;
        uVar372 = (ushort)(auVar362._14_2_ + auVar255._14_2_ + in_XMM10._14_2_) >> 5;
        auVar158._0_2_ = CONCAT11(0,auVar110[8]);
        auVar158[2] = auVar110[9];
        auVar158[3] = 0;
        auVar158[4] = auVar110[10];
        auVar158[5] = 0;
        auVar158[6] = auVar110[0xb];
        auVar158[7] = 0;
        auVar158[8] = auVar110[0xc];
        auVar158[9] = 0;
        auVar158[10] = auVar110[0xd];
        auVar158[0xb] = 0;
        auVar158[0xc] = auVar110[0xe];
        auVar158[0xd] = 0;
        auVar158[0xe] = auVar110[0xf];
        auVar158[0xf] = 0;
        auVar324 = psllw(auVar158,5);
        uVar106 = (ushort)(auVar324._0_2_ + auVar255._0_2_ +
                          (auVar320[8] - auVar158._0_2_) * auVar345._0_2_) >> 5;
        uVar164 = (ushort)(auVar324._2_2_ + auVar255._2_2_ +
                          ((ushort)auVar320[9] - (ushort)auVar110[9]) * auVar345._2_2_) >> 5;
        uVar166 = (ushort)(auVar324._4_2_ + auVar255._4_2_ +
                          ((ushort)auVar320[10] - (ushort)auVar110[10]) * auVar345._4_2_) >> 5;
        uVar167 = (ushort)(auVar324._6_2_ + auVar255._6_2_ +
                          ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * auVar345._6_2_) >> 5;
        uVar168 = (ushort)(auVar324._8_2_ + auVar255._8_2_ +
                          ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * auVar345._8_2_) >> 5;
        uVar169 = (ushort)(auVar324._10_2_ + auVar255._10_2_ +
                          ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * auVar345._10_2_) >> 5;
        uVar170 = (ushort)(auVar324._12_2_ + auVar255._12_2_ +
                          ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * auVar345._12_2_) >> 5;
        uVar171 = (ushort)(auVar324._14_2_ + auVar255._14_2_ +
                          ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * auVar345._14_2_) >> 5;
        in_XMM9[1] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 - (0xff < uVar366);
        in_XMM9[0] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361);
        in_XMM9[2] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
        in_XMM9[3] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
        in_XMM9[4] = (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
        in_XMM9[5] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
        in_XMM9[6] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
        in_XMM9[7] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
        in_XMM9[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
        in_XMM9[9] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
        in_XMM9[10] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
        in_XMM9[0xb] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
        in_XMM9[0xc] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
        in_XMM9[0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
        in_XMM9[0xe] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
        in_XMM9[0xf] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
        auVar110 = pblendvb(auVar179,in_XMM9,(undefined1  [16])Mask[0][uVar105]);
        *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar110;
        uVar98 = uVar98 + dy;
      }
      goto LAB_002e6dbc;
    }
    if (bw == 0x20) {
      auVar179 = pshufb(ZEXT116(left[0x3f]),(undefined1  [16])0x0);
      lVar99 = 0;
      auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
      lVar100 = 0;
      uVar98 = dy;
      do {
        if (lVar100 == 0x20) break;
        iVar101 = (int)uVar98 >> 6;
        lVar103 = lVar99;
        if (iVar101 < 0x3f) {
          uVar104 = -(iVar101 + -0x3f);
          auVar318 = ZEXT416(uVar98 >> 1 & 0x1f);
          auVar318 = pshuflw(auVar318,auVar318,0);
          for (lVar103 = 0; lVar103 != 0x20; lVar103 = lVar103 + 0x10) {
            auVar286 = auVar179;
            if (lVar103 < (int)uVar104) {
              auVar110 = *(undefined1 (*) [16])(left + lVar103 + iVar101);
              auVar320 = *(undefined1 (*) [16])(left + lVar103 + (long)iVar101 + 1);
              auVar324 = pmovzxbw(auVar179,auVar110);
              auVar373 = pmovzxbw(in_XMM7,auVar320);
              auVar362 = psllw(auVar324,5);
              sVar107 = auVar318._0_2_;
              in_XMM7._0_2_ = (auVar373._0_2_ - auVar324._0_2_) * sVar107;
              sVar165 = auVar318._2_2_;
              in_XMM7._2_2_ = (auVar373._2_2_ - auVar324._2_2_) * sVar165;
              in_XMM7._4_2_ = (auVar373._4_2_ - auVar324._4_2_) * sVar107;
              in_XMM7._6_2_ = (auVar373._6_2_ - auVar324._6_2_) * sVar165;
              in_XMM7._8_2_ = (auVar373._8_2_ - auVar324._8_2_) * sVar107;
              in_XMM7._10_2_ = (auVar373._10_2_ - auVar324._10_2_) * sVar165;
              in_XMM7._12_2_ = (auVar373._12_2_ - auVar324._12_2_) * sVar107;
              in_XMM7._14_2_ = (auVar373._14_2_ - auVar324._14_2_) * sVar165;
              uVar106 = (ushort)(auVar362._0_2_ + auVar255._0_2_ + in_XMM7._0_2_) >> 5;
              uVar164 = (ushort)(auVar362._2_2_ + auVar255._2_2_ + in_XMM7._2_2_) >> 5;
              uVar166 = (ushort)(auVar362._4_2_ + auVar255._4_2_ + in_XMM7._4_2_) >> 5;
              uVar167 = (ushort)(auVar362._6_2_ + auVar255._6_2_ + in_XMM7._6_2_) >> 5;
              uVar168 = (ushort)(auVar362._8_2_ + auVar255._8_2_ + in_XMM7._8_2_) >> 5;
              uVar169 = (ushort)(auVar362._10_2_ + auVar255._10_2_ + in_XMM7._10_2_) >> 5;
              uVar170 = (ushort)(auVar362._12_2_ + auVar255._12_2_ + in_XMM7._12_2_) >> 5;
              uVar171 = (ushort)(auVar362._14_2_ + auVar255._14_2_ + in_XMM7._14_2_) >> 5;
              auVar307._0_2_ = CONCAT11(0,auVar110[8]);
              auVar307[2] = auVar110[9];
              auVar307[3] = 0;
              auVar307[4] = auVar110[10];
              auVar307[5] = 0;
              auVar307[6] = auVar110[0xb];
              auVar307[7] = 0;
              auVar307[8] = auVar110[0xc];
              auVar307[9] = 0;
              auVar307[10] = auVar110[0xd];
              auVar307[0xb] = 0;
              auVar307[0xc] = auVar110[0xe];
              auVar307[0xd] = 0;
              auVar307[0xe] = auVar110[0xf];
              auVar307[0xf] = 0;
              auVar324 = psllw(auVar307,5);
              uVar361 = (ushort)(auVar324._0_2_ + auVar255._0_2_ +
                                (auVar320[8] - auVar307._0_2_) * sVar107) >> 5;
              uVar366 = (ushort)(auVar324._2_2_ + auVar255._2_2_ +
                                ((ushort)auVar320[9] - (ushort)auVar110[9]) * sVar165) >> 5;
              uVar367 = (ushort)(auVar324._4_2_ + auVar255._4_2_ +
                                ((ushort)auVar320[10] - (ushort)auVar110[10]) * sVar107) >> 5;
              uVar368 = (ushort)(auVar324._6_2_ + auVar255._6_2_ +
                                ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * sVar165) >> 5;
              uVar369 = (ushort)(auVar324._8_2_ + auVar255._8_2_ +
                                ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * sVar107) >> 5;
              uVar370 = (ushort)(auVar324._10_2_ + auVar255._10_2_ +
                                ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * sVar165) >> 5;
              uVar371 = (ushort)(auVar324._12_2_ + auVar255._12_2_ +
                                ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * sVar107) >> 5;
              uVar372 = (ushort)(auVar324._14_2_ + auVar255._14_2_ +
                                ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * sVar165) >> 5;
              auVar286[1] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
              auVar286[0] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
              auVar286[2] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
              auVar286[3] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
              auVar286[4] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
              auVar286[5] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
              auVar286[6] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
              auVar286[7] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
              auVar286[8] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361);
              auVar286[9] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 - (0xff < uVar366);
              auVar286[10] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
              auVar286[0xb] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
              auVar286[0xc] = (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
              auVar286[0xd] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
              auVar286[0xe] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
              auVar286[0xf] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
            }
            *(undefined1 (*) [16])((long)d[0] + lVar103) = auVar286;
          }
          if (0x1f < uVar104) {
            uVar104 = 0x20;
          }
          auVar3._8_8_ = d[0][1];
          auVar3._0_8_ = d[0][0];
          alVar287 = (__m128i)pblendvb(auVar179,auVar3,
                                       *(undefined1 (*) [16])(Mask[0][0] + (uVar104 << 4)));
          auVar6[1] = d[1][0]._1_1_;
          auVar6[0] = (undefined1)d[1][0];
          auVar6[2] = d[1][0]._2_1_;
          auVar6[3] = d[1][0]._3_1_;
          auVar6[4] = d[1][0]._4_1_;
          auVar6[5] = d[1][0]._5_1_;
          auVar6[6] = d[1][0]._6_1_;
          auVar6[7] = d[1][0]._7_1_;
          auVar6[8] = (undefined1)d[1][1];
          auVar6[9] = d[1][1]._1_1_;
          auVar6[10] = d[1][1]._2_1_;
          auVar6[0xb] = d[1][1]._3_1_;
          auVar6[0xc] = d[1][1]._4_1_;
          auVar6[0xd] = d[1][1]._5_1_;
          auVar6[0xe] = d[1][1]._6_1_;
          auVar6[0xf] = d[1][1]._7_1_;
          alVar308 = (__m128i)pblendvb(auVar179,auVar6,
                                       *(undefined1 (*) [16])(Mask[1][0] + (uVar104 << 4)));
          dstvec[lVar100] = alVar287;
          dstvec_h[lVar100] = alVar308;
          uVar98 = uVar98 + dy;
        }
        else {
          for (; lVar103 != 0x200; lVar103 = lVar103 + 0x10) {
            *(undefined1 (*) [16])((long)dstvec[0] + lVar103) = auVar179;
            *(undefined1 (*) [16])((long)dstvec_h[0] + lVar103) = auVar179;
          }
        }
        lVar100 = lVar100 + 1;
        lVar99 = lVar99 + 0x10;
      } while (iVar101 < 0x3f);
      transpose16x16_sse2(dstvec,d);
      transpose16x16_sse2(dstvec_h,(__m128i *)local_238);
      transpose16x16_sse2(dstvec + 0x10,d + 0x10);
      transpose16x16_sse2(dstvec_h + 0x10,(__m128i *)(local_238 + 0x20));
      puVar96 = dst + 0x10;
      for (lVar99 = 0; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
        uVar174 = *(undefined8 *)((long)d[0] + lVar99 + 8);
        *(undefined8 *)(puVar96 + -0x10) = *(undefined8 *)((long)d[0] + lVar99);
        *(undefined8 *)(puVar96 + -8) = uVar174;
        uVar174 = *(undefined8 *)((long)d[0x10] + lVar99 + 8);
        *(undefined8 *)puVar96 = *(undefined8 *)((long)d[0x10] + lVar99);
        *(undefined8 *)(puVar96 + 8) = uVar174;
        puVar96 = puVar96 + stride;
      }
      puVar96 = dst + stride * 0x10 + 0x10;
      for (lVar99 = 0; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
        uVar174 = *(undefined8 *)((long)local_238 + lVar99 + 8);
        *(undefined8 *)(puVar96 + -0x10) = *(undefined8 *)((long)local_238 + lVar99);
        *(undefined8 *)(puVar96 + -8) = uVar174;
        uVar174 = *(undefined8 *)((long)local_238 + lVar99 + 0x108);
        *(undefined8 *)puVar96 = *(undefined8 *)((long)local_238 + lVar99 + 0x100);
        *(undefined8 *)(puVar96 + 8) = uVar174;
        puVar96 = puVar96 + stride;
      }
      return;
    }
    if (bw != 4) {
      return;
    }
    iVar101 = 7 << (bVar97 & 0x1f);
    auVar179 = pshufb(ZEXT116(left[iVar101]),(undefined1  [16])0x0);
    lVar99 = 0;
    auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
    auVar318 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
    uVar98 = dy;
    while( true ) {
      if (lVar99 == 0x40) break;
      iVar102 = (int)uVar98 >> (6 - bVar97 & 0x1f);
      uVar104 = iVar101 - iVar102 >> (bVar97 & 0x1f);
      if ((int)uVar104 < 1) goto LAB_002e5e6d;
      uVar105 = (ulong)uVar104;
      if (3 < uVar104) {
        uVar105 = 4;
      }
      auVar110 = *(undefined1 (*) [16])(left + iVar102);
      if (upsample_left == 0) {
        auVar320 = *(undefined1 (*) [16])(left + (long)iVar102 + 1);
        auVar324 = ZEXT416(uVar98 >> 1 & 0x1f);
        auVar324 = pshuflw(auVar324,auVar324,0);
        auVar327._0_4_ = auVar324._0_4_;
        auVar327._4_4_ = auVar327._0_4_;
        auVar327._8_4_ = auVar327._0_4_;
        auVar327._12_4_ = auVar327._0_4_;
      }
      else {
        auVar110 = pshufb(auVar110,_DAT_00468e70);
        auVar320 = auVar110 >> 0x40;
        auVar324 = pshuflw(ZEXT416(uVar98),ZEXT416(uVar98),0);
        auVar325._0_4_ = auVar324._0_4_;
        auVar325._4_4_ = auVar325._0_4_;
        auVar325._8_4_ = auVar325._0_4_;
        auVar325._12_4_ = auVar325._0_4_;
        auVar324 = psllw(auVar325,ZEXT416((uint)upsample_left));
        auVar326._0_2_ = auVar324._0_2_ >> 1;
        auVar326._2_2_ = auVar324._2_2_ >> 1;
        auVar326._4_2_ = auVar324._4_2_ >> 1;
        auVar326._6_2_ = auVar324._6_2_ >> 1;
        auVar326._8_2_ = auVar324._8_2_ >> 1;
        auVar326._10_2_ = auVar324._10_2_ >> 1;
        auVar326._12_2_ = auVar324._12_2_ >> 1;
        auVar326._14_2_ = auVar324._14_2_ >> 1;
        auVar327 = auVar326 & auVar318;
      }
      auVar324 = pmovzxbw(in_XMM9,auVar110);
      auVar373 = pmovzxbw(in_XMM10,auVar320);
      auVar362 = psllw(auVar324,5);
      in_XMM10._0_2_ = (auVar373._0_2_ - auVar324._0_2_) * auVar327._0_2_;
      in_XMM10._2_2_ = (auVar373._2_2_ - auVar324._2_2_) * auVar327._2_2_;
      in_XMM10._4_2_ = (auVar373._4_2_ - auVar324._4_2_) * auVar327._4_2_;
      in_XMM10._6_2_ = (auVar373._6_2_ - auVar324._6_2_) * auVar327._6_2_;
      in_XMM10._8_2_ = (auVar373._8_2_ - auVar324._8_2_) * auVar327._8_2_;
      in_XMM10._10_2_ = (auVar373._10_2_ - auVar324._10_2_) * auVar327._10_2_;
      in_XMM10._12_2_ = (auVar373._12_2_ - auVar324._12_2_) * auVar327._12_2_;
      in_XMM10._14_2_ = (auVar373._14_2_ - auVar324._14_2_) * auVar327._14_2_;
      uVar361 = (ushort)(auVar362._0_2_ + auVar255._0_2_ + in_XMM10._0_2_) >> 5;
      uVar366 = (ushort)(auVar362._2_2_ + auVar255._2_2_ + in_XMM10._2_2_) >> 5;
      uVar367 = (ushort)(auVar362._4_2_ + auVar255._4_2_ + in_XMM10._4_2_) >> 5;
      uVar368 = (ushort)(auVar362._6_2_ + auVar255._6_2_ + in_XMM10._6_2_) >> 5;
      uVar369 = (ushort)(auVar362._8_2_ + auVar255._8_2_ + in_XMM10._8_2_) >> 5;
      uVar370 = (ushort)(auVar362._10_2_ + auVar255._10_2_ + in_XMM10._10_2_) >> 5;
      uVar371 = (ushort)(auVar362._12_2_ + auVar255._12_2_ + in_XMM10._12_2_) >> 5;
      uVar372 = (ushort)(auVar362._14_2_ + auVar255._14_2_ + in_XMM10._14_2_) >> 5;
      auVar111._0_2_ = CONCAT11(0,auVar110[8]);
      auVar111[2] = auVar110[9];
      auVar111[3] = 0;
      auVar111[4] = auVar110[10];
      auVar111[5] = 0;
      auVar111[6] = auVar110[0xb];
      auVar111[7] = 0;
      auVar111[8] = auVar110[0xc];
      auVar111[9] = 0;
      auVar111[10] = auVar110[0xd];
      auVar111[0xb] = 0;
      auVar111[0xc] = auVar110[0xe];
      auVar111[0xd] = 0;
      auVar111[0xe] = auVar110[0xf];
      auVar111[0xf] = 0;
      auVar324 = psllw(auVar111,5);
      uVar106 = (ushort)(auVar324._0_2_ + auVar255._0_2_ +
                        (auVar320[8] - auVar111._0_2_) * auVar327._0_2_) >> 5;
      uVar164 = (ushort)(auVar324._2_2_ + auVar255._2_2_ +
                        ((ushort)auVar320[9] - (ushort)auVar110[9]) * auVar327._2_2_) >> 5;
      uVar166 = (ushort)(auVar324._4_2_ + auVar255._4_2_ +
                        ((ushort)auVar320[10] - (ushort)auVar110[10]) * auVar327._4_2_) >> 5;
      uVar167 = (ushort)(auVar324._6_2_ + auVar255._6_2_ +
                        ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * auVar327._6_2_) >> 5;
      uVar168 = (ushort)(auVar324._8_2_ + auVar255._8_2_ +
                        ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * auVar327._8_2_) >> 5;
      uVar169 = (ushort)(auVar324._10_2_ + auVar255._10_2_ +
                        ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * auVar327._10_2_) >> 5;
      uVar170 = (ushort)(auVar324._12_2_ + auVar255._12_2_ +
                        ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * auVar327._12_2_) >> 5;
      uVar171 = (ushort)(auVar324._14_2_ + auVar255._14_2_ +
                        ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * auVar327._14_2_) >> 5;
      in_XMM9[1] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 - (0xff < uVar366);
      in_XMM9[0] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361);
      in_XMM9[2] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
      in_XMM9[3] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
      in_XMM9[4] = (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
      in_XMM9[5] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
      in_XMM9[6] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
      in_XMM9[7] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
      in_XMM9[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
      in_XMM9[9] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
      in_XMM9[10] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
      in_XMM9[0xb] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
      in_XMM9[0xc] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
      in_XMM9[0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
      in_XMM9[0xe] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
      in_XMM9[0xf] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
      auVar110 = pblendvb(auVar179,in_XMM9,(undefined1  [16])Mask[0][uVar105]);
      *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar110;
      uVar98 = uVar98 + dy;
      lVar99 = lVar99 + 0x10;
    }
    goto LAB_002e5e73;
  }
  iVar101 = 0xf << (bVar97 & 0x1f);
  auVar179 = pshufb(ZEXT116(left[iVar101]),(undefined1  [16])0x0);
  lVar99 = 0;
  auVar255 = pmovsxbw(in_XMM3,0x1010101010101010);
  auVar318 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
  uVar98 = dy;
  while( true ) {
    if (lVar99 == 0x80) break;
    iVar102 = (int)uVar98 >> (6 - bVar97 & 0x1f);
    uVar104 = iVar101 - iVar102 >> (bVar97 & 0x1f);
    if ((int)uVar104 < 1) goto LAB_002e6942;
    uVar105 = (ulong)uVar104;
    if (7 < uVar104) {
      uVar105 = 8;
    }
    auVar110 = *(undefined1 (*) [16])(left + iVar102);
    if (upsample_left == 0) {
      auVar320 = *(undefined1 (*) [16])(left + (long)iVar102 + 1);
      auVar324 = ZEXT416(uVar98 >> 1 & 0x1f);
      auVar324 = pshuflw(auVar324,auVar324,0);
      auVar342._0_4_ = auVar324._0_4_;
      auVar342._4_4_ = auVar342._0_4_;
      auVar342._8_4_ = auVar342._0_4_;
      auVar342._12_4_ = auVar342._0_4_;
    }
    else {
      auVar110 = pshufb(auVar110,_DAT_00468e70);
      auVar320 = auVar110 >> 0x40;
      auVar324 = pshuflw(ZEXT416(uVar98),ZEXT416(uVar98),0);
      auVar340._0_4_ = auVar324._0_4_;
      auVar340._4_4_ = auVar340._0_4_;
      auVar340._8_4_ = auVar340._0_4_;
      auVar340._12_4_ = auVar340._0_4_;
      auVar324 = psllw(auVar340,ZEXT416((uint)upsample_left));
      auVar341._0_2_ = auVar324._0_2_ >> 1;
      auVar341._2_2_ = auVar324._2_2_ >> 1;
      auVar341._4_2_ = auVar324._4_2_ >> 1;
      auVar341._6_2_ = auVar324._6_2_ >> 1;
      auVar341._8_2_ = auVar324._8_2_ >> 1;
      auVar341._10_2_ = auVar324._10_2_ >> 1;
      auVar341._12_2_ = auVar324._12_2_ >> 1;
      auVar341._14_2_ = auVar324._14_2_ >> 1;
      auVar342 = auVar341 & auVar318;
    }
    auVar324 = pmovzxbw(in_XMM9,auVar110);
    auVar373 = pmovzxbw(in_XMM10,auVar320);
    auVar362 = psllw(auVar324,5);
    in_XMM10._0_2_ = (auVar373._0_2_ - auVar324._0_2_) * auVar342._0_2_;
    in_XMM10._2_2_ = (auVar373._2_2_ - auVar324._2_2_) * auVar342._2_2_;
    in_XMM10._4_2_ = (auVar373._4_2_ - auVar324._4_2_) * auVar342._4_2_;
    in_XMM10._6_2_ = (auVar373._6_2_ - auVar324._6_2_) * auVar342._6_2_;
    in_XMM10._8_2_ = (auVar373._8_2_ - auVar324._8_2_) * auVar342._8_2_;
    in_XMM10._10_2_ = (auVar373._10_2_ - auVar324._10_2_) * auVar342._10_2_;
    in_XMM10._12_2_ = (auVar373._12_2_ - auVar324._12_2_) * auVar342._12_2_;
    in_XMM10._14_2_ = (auVar373._14_2_ - auVar324._14_2_) * auVar342._14_2_;
    uVar361 = (ushort)(auVar362._0_2_ + auVar255._0_2_ + in_XMM10._0_2_) >> 5;
    uVar366 = (ushort)(auVar362._2_2_ + auVar255._2_2_ + in_XMM10._2_2_) >> 5;
    uVar367 = (ushort)(auVar362._4_2_ + auVar255._4_2_ + in_XMM10._4_2_) >> 5;
    uVar368 = (ushort)(auVar362._6_2_ + auVar255._6_2_ + in_XMM10._6_2_) >> 5;
    uVar369 = (ushort)(auVar362._8_2_ + auVar255._8_2_ + in_XMM10._8_2_) >> 5;
    uVar370 = (ushort)(auVar362._10_2_ + auVar255._10_2_ + in_XMM10._10_2_) >> 5;
    uVar371 = (ushort)(auVar362._12_2_ + auVar255._12_2_ + in_XMM10._12_2_) >> 5;
    uVar372 = (ushort)(auVar362._14_2_ + auVar255._14_2_ + in_XMM10._14_2_) >> 5;
    auVar148._0_2_ = CONCAT11(0,auVar110[8]);
    auVar148[2] = auVar110[9];
    auVar148[3] = 0;
    auVar148[4] = auVar110[10];
    auVar148[5] = 0;
    auVar148[6] = auVar110[0xb];
    auVar148[7] = 0;
    auVar148[8] = auVar110[0xc];
    auVar148[9] = 0;
    auVar148[10] = auVar110[0xd];
    auVar148[0xb] = 0;
    auVar148[0xc] = auVar110[0xe];
    auVar148[0xd] = 0;
    auVar148[0xe] = auVar110[0xf];
    auVar148[0xf] = 0;
    auVar324 = psllw(auVar148,5);
    uVar106 = (ushort)(auVar324._0_2_ + auVar255._0_2_ +
                      (auVar320[8] - auVar148._0_2_) * auVar342._0_2_) >> 5;
    uVar164 = (ushort)(auVar324._2_2_ + auVar255._2_2_ +
                      ((ushort)auVar320[9] - (ushort)auVar110[9]) * auVar342._2_2_) >> 5;
    uVar166 = (ushort)(auVar324._4_2_ + auVar255._4_2_ +
                      ((ushort)auVar320[10] - (ushort)auVar110[10]) * auVar342._4_2_) >> 5;
    uVar167 = (ushort)(auVar324._6_2_ + auVar255._6_2_ +
                      ((ushort)auVar320[0xb] - (ushort)auVar110[0xb]) * auVar342._6_2_) >> 5;
    uVar168 = (ushort)(auVar324._8_2_ + auVar255._8_2_ +
                      ((ushort)auVar320[0xc] - (ushort)auVar110[0xc]) * auVar342._8_2_) >> 5;
    uVar169 = (ushort)(auVar324._10_2_ + auVar255._10_2_ +
                      ((ushort)auVar320[0xd] - (ushort)auVar110[0xd]) * auVar342._10_2_) >> 5;
    uVar170 = (ushort)(auVar324._12_2_ + auVar255._12_2_ +
                      ((ushort)auVar320[0xe] - (ushort)auVar110[0xe]) * auVar342._12_2_) >> 5;
    uVar171 = (ushort)(auVar324._14_2_ + auVar255._14_2_ +
                      ((ushort)auVar320[0xf] - (ushort)auVar110[0xf]) * auVar342._14_2_) >> 5;
    in_XMM9[1] = (uVar366 != 0) * (uVar366 < 0x100) * (char)uVar366 - (0xff < uVar366);
    in_XMM9[0] = (uVar361 != 0) * (uVar361 < 0x100) * (char)uVar361 - (0xff < uVar361);
    in_XMM9[2] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
    in_XMM9[3] = (uVar368 != 0) * (uVar368 < 0x100) * (char)uVar368 - (0xff < uVar368);
    in_XMM9[4] = (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
    in_XMM9[5] = (uVar370 != 0) * (uVar370 < 0x100) * (char)uVar370 - (0xff < uVar370);
    in_XMM9[6] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
    in_XMM9[7] = (uVar372 != 0) * (uVar372 < 0x100) * (char)uVar372 - (0xff < uVar372);
    in_XMM9[8] = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
    in_XMM9[9] = (uVar164 != 0) * (uVar164 < 0x100) * (char)uVar164 - (0xff < uVar164);
    in_XMM9[10] = (uVar166 != 0) * (uVar166 < 0x100) * (char)uVar166 - (0xff < uVar166);
    in_XMM9[0xb] = (uVar167 != 0) * (uVar167 < 0x100) * (char)uVar167 - (0xff < uVar167);
    in_XMM9[0xc] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
    in_XMM9[0xd] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
    in_XMM9[0xe] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
    in_XMM9[0xf] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
    auVar110 = pblendvb(auVar179,in_XMM9,(undefined1  [16])Mask[0][uVar105]);
    *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar110;
    uVar98 = uVar98 + dy;
    lVar99 = lVar99 + 0x10;
  }
  goto LAB_002e694b;
LAB_002e62a5:
  while( true ) {
    if (lVar99 == 0x80) break;
    *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar179;
    lVar99 = lVar99 + 0x10;
  }
LAB_002e62ae:
  uVar98 = CONCAT22((undefined2)dstvec[4][1],dstvec[4][0]._6_2_);
  auVar232._0_9_ = (unkuint9)uVar98 << 0x30;
  uVar58 = CONCAT24(dstvec[4][1]._2_2_,uVar98);
  auVar64._6_5_ = 0;
  auVar64._0_6_ = uVar58;
  auVar233._0_11_ = auVar64 << 0x30;
  auVar72._8_5_ = 0;
  auVar72._0_8_ = CONCAT26(dstvec[4][1]._4_2_,uVar58);
  auVar234._0_13_ = auVar72 << 0x30;
  auVar135[0xe] = dstvec[0][0]._7_1_;
  auVar135._0_14_ = dstvec[0]._0_14_;
  auVar135[0xf] = dstvec[1][0]._7_1_;
  auVar134._14_2_ = auVar135._14_2_;
  auVar134._0_13_ = dstvec[0]._0_13_;
  auVar134[0xd] = dstvec[1][0]._6_1_;
  auVar133._13_3_ = auVar134._13_3_;
  auVar133._0_12_ = dstvec[0]._0_12_;
  auVar133[0xc] = dstvec[0][0]._6_1_;
  auVar318._12_4_ = auVar133._12_4_;
  auVar318._0_11_ = dstvec[0]._0_11_;
  auVar318[0xb] = dstvec[1][0]._5_1_;
  auVar179._11_5_ = auVar318._11_5_;
  auVar179._0_10_ = dstvec[0]._0_10_;
  auVar179[10] = dstvec[0][0]._5_1_;
  auVar255._10_6_ = auVar179._10_6_;
  auVar255._0_9_ = dstvec[0]._0_9_;
  auVar255[9] = dstvec[1][0]._4_1_;
  auVar110._9_7_ = auVar255._9_7_;
  auVar110._0_8_ = dstvec[0][0];
  auVar110[8] = dstvec[0][0]._4_1_;
  Var15 = CONCAT91(CONCAT81(auVar110._8_8_,dstvec[1][0]._3_1_),dstvec[0][0]._3_1_);
  auVar26._2_10_ = Var15;
  auVar26[1] = dstvec[1][0]._2_1_;
  auVar26[0] = dstvec[0][0]._2_1_;
  auVar25._2_12_ = auVar26;
  auVar25[1] = dstvec[1][0]._1_1_;
  auVar25[0] = dstvec[0][0]._1_1_;
  uVar376 = CONCAT11((undefined1)dstvec[1][0],(char)dstvec[0][0]);
  auVar320._2_14_ = auVar25;
  uVar104 = CONCAT22((undefined2)dstvec[6][1],dstvec[6][0]._6_2_);
  auVar256._0_9_ = (unkuint9)uVar104 << 0x30;
  uVar59 = CONCAT24(dstvec[6][1]._2_2_,uVar104);
  auVar65._6_5_ = 0;
  auVar65._0_6_ = uVar59;
  auVar257._0_11_ = auVar65 << 0x30;
  auVar73._8_5_ = 0;
  auVar73._0_8_ = CONCAT26(dstvec[6][1]._4_2_,uVar59);
  auVar258._0_13_ = auVar73 << 0x30;
  auVar200[0xe] = dstvec[2][0]._7_1_;
  auVar200._0_14_ = dstvec[2]._0_14_;
  auVar200[0xf] = dstvec[3][0]._7_1_;
  auVar199._14_2_ = auVar200._14_2_;
  auVar199._0_13_ = dstvec[2]._0_13_;
  auVar199[0xd] = dstvec[3][0]._6_1_;
  auVar198._13_3_ = auVar199._13_3_;
  auVar198._0_12_ = dstvec[2]._0_12_;
  auVar198[0xc] = dstvec[2][0]._6_1_;
  auVar197._12_4_ = auVar198._12_4_;
  auVar197._0_11_ = dstvec[2]._0_11_;
  auVar197[0xb] = dstvec[3][0]._5_1_;
  auVar196._11_5_ = auVar197._11_5_;
  auVar196._0_10_ = dstvec[2]._0_10_;
  auVar196[10] = dstvec[2][0]._5_1_;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._0_9_ = dstvec[2]._0_9_;
  auVar195[9] = dstvec[3][0]._4_1_;
  auVar194._9_7_ = auVar195._9_7_;
  auVar194._0_8_ = dstvec[2][0];
  auVar194[8] = dstvec[2][0]._4_1_;
  Var18 = CONCAT91(CONCAT81(auVar194._8_8_,dstvec[3][0]._3_1_),dstvec[2][0]._3_1_);
  auVar28._2_10_ = Var18;
  auVar28[1] = dstvec[3][0]._2_1_;
  auVar28[0] = dstvec[2][0]._2_1_;
  auVar27._2_12_ = auVar28;
  auVar27[1] = dstvec[3][0]._1_1_;
  auVar27[0] = dstvec[2][0]._1_1_;
  auVar139._0_12_ = auVar320._0_12_;
  auVar139._12_2_ = (short)Var15;
  auVar139._14_2_ = (short)Var18;
  auVar138._12_4_ = auVar139._12_4_;
  auVar138._0_10_ = auVar320._0_10_;
  auVar138._10_2_ = auVar28._0_2_;
  auVar137._10_6_ = auVar138._10_6_;
  auVar137._0_8_ = auVar320._0_8_;
  auVar137._8_2_ = auVar26._0_2_;
  auVar29._4_8_ = auVar137._8_8_;
  auVar29._2_2_ = auVar27._0_2_;
  auVar29._0_2_ = auVar25._0_2_;
  auVar136._0_4_ = CONCAT22(CONCAT11((undefined1)dstvec[3][0],(char)dstvec[2][0]),uVar376);
  auVar136._4_12_ = auVar29;
  auVar234._14_2_ =
       (undefined2)
       (CONCAT19(dstvec[5][0]._7_1_,
                 CONCAT18((char)((ushort)dstvec[4][0]._6_2_ >> 8),
                          CONCAT26(dstvec[4][1]._4_2_,uVar58))) >> 0x40);
  auVar234[0xd] = dstvec[5][0]._6_1_;
  auVar233._12_4_ =
       (undefined4)(CONCAT37(auVar234._13_3_,CONCAT16((char)dstvec[4][0]._6_2_,uVar58)) >> 0x30);
  auVar233[0xb] = dstvec[5][0]._5_1_;
  auVar232._10_6_ =
       (undefined6)
       (CONCAT55(auVar233._11_5_,CONCAT14((char)((ushort)dstvec[4][0]._4_2_ >> 8),uVar98)) >> 0x20);
  auVar232[9] = dstvec[5][0]._4_1_;
  Var15 = CONCAT91(CONCAT81((long)(CONCAT73(auVar232._9_7_,
                                            CONCAT12((char)dstvec[4][0]._4_2_,dstvec[4][0]._6_2_))
                                  >> 0x10),dstvec[5][0]._3_1_),
                   (char)((ushort)dstvec[4][0]._2_2_ >> 8));
  auVar31._2_10_ = Var15;
  auVar31[1] = dstvec[5][0]._2_1_;
  auVar31[0] = (char)dstvec[4][0]._2_2_;
  auVar30._2_12_ = auVar31;
  auVar30[1] = dstvec[5][0]._1_1_;
  auVar30[0] = (char)((ushort)(undefined2)dstvec[4][0] >> 8);
  uVar377 = CONCAT11((undefined1)dstvec[5][0],(char)(undefined2)dstvec[4][0]);
  auVar231._2_14_ = auVar30;
  auVar258._14_2_ =
       (undefined2)
       (CONCAT19(dstvec[7][0]._7_1_,
                 CONCAT18((char)((ushort)dstvec[6][0]._6_2_ >> 8),
                          CONCAT26(dstvec[6][1]._4_2_,uVar59))) >> 0x40);
  auVar258[0xd] = dstvec[7][0]._6_1_;
  auVar257._12_4_ =
       (undefined4)(CONCAT37(auVar258._13_3_,CONCAT16((char)dstvec[6][0]._6_2_,uVar59)) >> 0x30);
  auVar257[0xb] = dstvec[7][0]._5_1_;
  auVar256._10_6_ =
       (undefined6)(CONCAT55(auVar257._11_5_,CONCAT14(dstvec[6][0]._5_1_,uVar104)) >> 0x20);
  auVar256[9] = dstvec[7][0]._4_1_;
  Var18 = CONCAT91(CONCAT81((long)(((unkuint10)auVar256._9_7_ << 0x18) >> 0x10),dstvec[7][0]._3_1_),
                   (char)((ushort)dstvec[6][0]._2_2_ >> 8));
  auVar33._2_10_ = Var18;
  auVar33[1] = dstvec[7][0]._2_1_;
  auVar33[0] = (char)dstvec[6][0]._2_2_;
  auVar32._2_12_ = auVar33;
  auVar32[1] = dstvec[7][0]._1_1_;
  auVar32[0] = (char)((ushort)(undefined2)dstvec[6][0] >> 8);
  auVar237._0_12_ = auVar231._0_12_;
  auVar237._12_2_ = (short)Var15;
  auVar237._14_2_ = (short)Var18;
  auVar236._12_4_ = auVar237._12_4_;
  auVar236._0_10_ = auVar231._0_10_;
  auVar236._10_2_ = auVar33._0_2_;
  auVar235._10_6_ = auVar236._10_6_;
  auVar235._0_8_ = auVar231._0_8_;
  auVar235._8_2_ = auVar31._0_2_;
  auVar34._4_8_ = auVar235._8_8_;
  auVar34._2_2_ = auVar32._0_2_;
  auVar34._0_2_ = auVar30._0_2_;
  auVar201._0_8_ = auVar136._0_8_;
  auVar201._8_4_ = auVar29._0_4_;
  auVar201._12_4_ = auVar34._0_4_;
  *(ulong *)dst =
       CONCAT44(CONCAT22(CONCAT11((undefined1)dstvec[7][0],(char)(undefined2)dstvec[6][0]),uVar377),
                auVar136._0_4_);
  *(long *)(dst + stride) = auVar201._8_8_;
  *(int *)(dst + stride * 2) = auVar137._8_4_;
  *(int *)(dst + stride * 2 + 4) = auVar235._8_4_;
  lVar99 = stride * 3;
  goto LAB_002e6a02;
LAB_002e712b:
  for (; lVar99 != 0x200; lVar99 = lVar99 + 0x10) {
    *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar179;
  }
LAB_002e7134:
  transpose16x8_8x16_sse2
            (dstvec,dstvec + 1,dstvec + 2,dstvec + 3,dstvec + 4,dstvec + 5,dstvec + 6,dstvec + 7,
             dstvec + 8,dstvec + 9,dstvec + 10,dstvec + 0xb,dstvec + 0xc,dstvec + 0xd,dstvec + 0xe,
             dstvec + 0xf,d,d + 1,d + 2,d + 3,d + 4,d + 5,d + 6,d + 7);
  transpose16x8_8x16_sse2
            (dstvec + 0x10,dstvec + 0x11,dstvec + 0x12,dstvec + 0x13,dstvec + 0x14,dstvec + 0x15,
             dstvec + 0x16,dstvec + 0x17,dstvec + 0x18,dstvec + 0x19,dstvec + 0x1a,dstvec + 0x1b,
             dstvec + 0x1c,dstvec + 0x1d,dstvec + 0x1e,dstvec + 0x1f,d + 8,d + 9,d + 10,d + 0xb,
             d + 0xc,d + 0xd,d + 0xe,d + 0xf);
  puVar96 = dst + 0x10;
  for (lVar99 = 0; lVar99 != 0x80; lVar99 = lVar99 + 0x10) {
    uVar174 = *(undefined8 *)((long)d[0] + lVar99 + 8);
    *(undefined8 *)(puVar96 + -0x10) = *(undefined8 *)((long)d[0] + lVar99);
    *(undefined8 *)(puVar96 + -8) = uVar174;
    uVar174 = *(undefined8 *)((long)d[8] + lVar99 + 8);
    *(undefined8 *)puVar96 = *(undefined8 *)((long)d[8] + lVar99);
    *(undefined8 *)(puVar96 + 8) = uVar174;
    puVar96 = puVar96 + stride;
  }
  return;
LAB_002e753e:
  for (; lVar99 != 0x400; lVar99 = lVar99 + 0x10) {
    *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar179;
  }
LAB_002e7547:
  for (uVar105 = 0; uVar105 < 0x40; uVar105 = uVar105 + 0x10) {
    transpose16x16_sse2(dstvec + uVar105,d);
    puVar96 = dst;
    for (lVar99 = 0; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
      uVar174 = *(undefined8 *)((long)d[0] + lVar99 + 8);
      *(undefined8 *)puVar96 = *(undefined8 *)((long)d[0] + lVar99);
      *(undefined8 *)(puVar96 + 8) = uVar174;
      puVar96 = puVar96 + stride;
    }
    dst = dst + 0x10;
  }
  return;
LAB_002e79c5:
  for (; lVar99 != 0x200; lVar99 = lVar99 + 0x10) {
    *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar179;
  }
LAB_002e79ce:
  for (uVar105 = 0; uVar105 < 0x20; uVar105 = uVar105 + 0x10) {
    transpose16x16_sse2(dstvec + uVar105,d);
    puVar96 = dst;
    for (lVar99 = 0; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
      uVar174 = *(undefined8 *)((long)d[0] + lVar99 + 8);
      *(undefined8 *)puVar96 = *(undefined8 *)((long)d[0] + lVar99);
      *(undefined8 *)(puVar96 + 8) = uVar174;
      puVar96 = puVar96 + stride;
    }
    dst = dst + 0x10;
  }
  return;
LAB_002e7e8b:
  for (; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
    *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar179;
  }
LAB_002e7e94:
  transpose16x8_8x16_sse2
            (dstvec,dstvec + 1,dstvec + 2,dstvec + 3,dstvec + 4,dstvec + 5,dstvec + 6,dstvec + 7,
             dstvec + 8,dstvec + 9,dstvec + 10,dstvec + 0xb,dstvec + 0xc,dstvec + 0xd,dstvec + 0xe,
             dstvec + 0xf,d,d + 1,d + 2,d + 3,d + 4,d + 5,d + 6,d + 7);
  for (lVar99 = 0; lVar99 != 0x80; lVar99 = lVar99 + 0x10) {
    uVar174 = *(undefined8 *)((long)d[0] + lVar99 + 8);
    *(undefined8 *)dst = *(undefined8 *)((long)d[0] + lVar99);
    *(undefined8 *)(dst + 8) = uVar174;
    dst = dst + stride;
  }
  return;
LAB_002e7b8e:
  for (; lVar99 != 0x80; lVar99 = lVar99 + 0x10) {
    *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar179;
  }
LAB_002e7b97:
  auVar217._0_14_ = dstvec[0]._0_14_;
  auVar217[0xe] = dstvec[0][0]._7_1_;
  auVar217[0xf] = dstvec[1][0]._7_1_;
  auVar216._14_2_ = auVar217._14_2_;
  auVar216._0_13_ = dstvec[0]._0_13_;
  auVar216[0xd] = dstvec[1][0]._6_1_;
  auVar215._13_3_ = auVar216._13_3_;
  auVar215._0_12_ = dstvec[0]._0_12_;
  auVar215[0xc] = dstvec[0][0]._6_1_;
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._0_11_ = dstvec[0]._0_11_;
  auVar214[0xb] = dstvec[1][0]._5_1_;
  auVar213._11_5_ = auVar214._11_5_;
  auVar213._0_10_ = dstvec[0]._0_10_;
  auVar213[10] = dstvec[0][0]._5_1_;
  auVar212._10_6_ = auVar213._10_6_;
  auVar212._0_9_ = dstvec[0]._0_9_;
  auVar212[9] = dstvec[1][0]._4_1_;
  auVar211._9_7_ = auVar212._9_7_;
  auVar211._0_8_ = dstvec[0][0];
  auVar211[8] = dstvec[0][0]._4_1_;
  Var15 = CONCAT91(CONCAT81(auVar211._8_8_,dstvec[1][0]._3_1_),dstvec[0][0]._3_1_);
  auVar52._2_10_ = Var15;
  auVar52[1] = dstvec[1][0]._2_1_;
  auVar52[0] = dstvec[0][0]._2_1_;
  auVar210._4_12_ = auVar52;
  auVar210[3] = dstvec[1][0]._1_1_;
  auVar210[2] = dstvec[0][0]._1_1_;
  auVar210._0_2_ = CONCAT11((undefined1)dstvec[1][0],(char)dstvec[0][0]);
  auVar317._0_14_ = dstvec[2]._0_14_;
  auVar317[0xe] = dstvec[2][0]._7_1_;
  auVar317[0xf] = dstvec[3][0]._7_1_;
  auVar316._14_2_ = auVar317._14_2_;
  auVar316._0_13_ = dstvec[2]._0_13_;
  auVar316[0xd] = dstvec[3][0]._6_1_;
  auVar315._13_3_ = auVar316._13_3_;
  auVar315._0_12_ = dstvec[2]._0_12_;
  auVar315[0xc] = dstvec[2][0]._6_1_;
  auVar314._12_4_ = auVar315._12_4_;
  auVar314._0_11_ = dstvec[2]._0_11_;
  auVar314[0xb] = dstvec[3][0]._5_1_;
  auVar313._11_5_ = auVar314._11_5_;
  auVar313._0_10_ = dstvec[2]._0_10_;
  auVar313[10] = dstvec[2][0]._5_1_;
  auVar312._10_6_ = auVar313._10_6_;
  auVar312._0_9_ = dstvec[2]._0_9_;
  auVar312[9] = dstvec[3][0]._4_1_;
  auVar311._9_7_ = auVar312._9_7_;
  auVar311._0_8_ = dstvec[2][0];
  auVar311[8] = dstvec[2][0]._4_1_;
  Var18 = CONCAT91(CONCAT81(auVar311._8_8_,dstvec[3][0]._3_1_),dstvec[2][0]._3_1_);
  auVar53._2_10_ = Var18;
  auVar53[1] = dstvec[3][0]._2_1_;
  auVar53[0] = dstvec[2][0]._2_1_;
  uVar98 = CONCAT22((undefined2)dstvec[4][1],dstvec[4][0]._6_2_);
  auVar291._0_9_ = (unkuint9)uVar98 << 0x30;
  uVar58 = CONCAT24(dstvec[4][1]._2_2_,uVar98);
  auVar70._6_5_ = 0;
  auVar70._0_6_ = uVar58;
  auVar292._0_11_ = auVar70 << 0x30;
  auVar76._8_5_ = 0;
  auVar76._0_8_ = CONCAT26(dstvec[4][1]._4_2_,uVar58);
  auVar293._0_13_ = auVar76 << 0x30;
  auVar293._14_2_ =
       (undefined2)
       (CONCAT19(dstvec[5][0]._7_1_,
                 CONCAT18((char)((ushort)dstvec[4][0]._6_2_ >> 8),
                          CONCAT26(dstvec[4][1]._4_2_,uVar58))) >> 0x40);
  auVar293[0xd] = dstvec[5][0]._6_1_;
  Var67 = CONCAT37(auVar293._13_3_,CONCAT16((char)dstvec[4][0]._6_2_,uVar58));
  auVar292._12_4_ = (undefined4)((unkuint10)Var67 >> 0x30);
  auVar292[0xb] = dstvec[5][0]._5_1_;
  Var62 = CONCAT55(auVar292._11_5_,CONCAT14((char)((ushort)dstvec[4][0]._4_2_ >> 8),uVar98));
  auVar291._10_6_ = (undefined6)((unkuint10)Var62 >> 0x20);
  auVar291[9] = dstvec[5][0]._4_1_;
  Var60 = CONCAT73(auVar291._9_7_,CONCAT12((char)dstvec[4][0]._4_2_,dstvec[4][0]._6_2_));
  Var46 = CONCAT91(CONCAT81((long)((unkuint10)Var60 >> 0x10),dstvec[5][0]._3_1_),
                   (char)((ushort)dstvec[4][0]._2_2_ >> 8));
  auVar54._2_10_ = Var46;
  auVar54[1] = dstvec[5][0]._2_1_;
  auVar54[0] = (char)dstvec[4][0]._2_2_;
  auVar290._4_12_ = auVar54;
  auVar290[3] = dstvec[5][0]._1_1_;
  d[1][0]._4_1_ = (undefined1)((ushort)(undefined2)dstvec[4][0] >> 8);
  auVar290[2] = d[1][0]._4_1_;
  auVar290._0_2_ = CONCAT11((undefined1)dstvec[5][0],(char)(undefined2)dstvec[4][0]);
  uVar98 = CONCAT22((undefined2)dstvec[6][1],dstvec[6][0]._6_2_);
  auVar321._0_9_ = (unkuint9)uVar98 << 0x30;
  uVar58 = CONCAT24(dstvec[6][1]._2_2_,uVar98);
  auVar71._6_5_ = 0;
  auVar71._0_6_ = uVar58;
  auVar322._0_11_ = auVar71 << 0x30;
  auVar77._8_5_ = 0;
  auVar77._0_8_ = CONCAT26(dstvec[6][1]._4_2_,uVar58);
  auVar323._0_13_ = auVar77 << 0x30;
  auVar323._14_2_ =
       (undefined2)
       (CONCAT19(dstvec[7][0]._7_1_,
                 CONCAT18((char)((ushort)dstvec[6][0]._6_2_ >> 8),
                          CONCAT26(dstvec[6][1]._4_2_,uVar58))) >> 0x40);
  auVar323[0xd] = dstvec[7][0]._6_1_;
  Var69 = CONCAT37(auVar323._13_3_,CONCAT16((char)dstvec[6][0]._6_2_,uVar58));
  auVar322._12_4_ = (undefined4)((unkuint10)Var69 >> 0x30);
  auVar322[0xb] = dstvec[7][0]._5_1_;
  Var63 = CONCAT55(auVar322._11_5_,CONCAT14((char)((ushort)dstvec[6][0]._4_2_ >> 8),uVar98));
  auVar321._10_6_ = (undefined6)((unkuint10)Var63 >> 0x20);
  auVar321[9] = dstvec[7][0]._4_1_;
  Var61 = CONCAT73(auVar321._9_7_,CONCAT12((char)dstvec[6][0]._4_2_,dstvec[6][0]._6_2_));
  Var49 = CONCAT91(CONCAT81((long)((unkuint10)Var61 >> 0x10),dstvec[7][0]._3_1_),
                   (char)((ushort)dstvec[6][0]._2_2_ >> 8));
  auVar55._2_10_ = Var49;
  auVar55[1] = dstvec[7][0]._2_1_;
  auVar55[0] = (char)dstvec[6][0]._2_2_;
  uVar172 = CONCAT11(dstvec[1][1]._2_1_,dstvec[0][1]._2_1_);
  auVar138._12_4_ = CONCAT13(dstvec[1][1]._3_1_,CONCAT12(dstvec[0][1]._3_1_,uVar172));
  uVar173 = CONCAT15(dstvec[1][1]._4_1_,CONCAT14(dstvec[0][1]._4_1_,auVar138._12_4_));
  uVar174 = CONCAT17(dstvec[1][1]._5_1_,CONCAT16(dstvec[0][1]._5_1_,uVar173));
  Var86 = CONCAT19(dstvec[1][1]._6_1_,CONCAT18(dstvec[0][1]._6_1_,uVar174));
  auVar92[10] = dstvec[0][1]._7_1_;
  auVar92._0_10_ = Var86;
  auVar92[0xb] = dstvec[1][1]._7_1_;
  uVar219 = CONCAT11(dstvec[3][1]._2_1_,dstvec[2][1]._2_1_);
  auVar236._12_4_ = CONCAT13(dstvec[3][1]._3_1_,CONCAT12(dstvec[2][1]._3_1_,uVar219));
  uVar222 = CONCAT15(dstvec[3][1]._4_1_,CONCAT14(dstvec[2][1]._4_1_,auVar236._12_4_));
  uVar223 = CONCAT17(dstvec[3][1]._5_1_,CONCAT16(dstvec[2][1]._5_1_,uVar222));
  Var87 = CONCAT19(dstvec[3][1]._6_1_,CONCAT18(dstvec[2][1]._6_1_,uVar223));
  auVar93[10] = dstvec[2][1]._7_1_;
  auVar93._0_10_ = Var87;
  auVar93[0xb] = dstvec[3][1]._7_1_;
  uVar56 = CONCAT11(dstvec[5][1]._2_1_,(char)dstvec[4][1]._2_2_);
  uVar221 = CONCAT13(dstvec[5][1]._3_1_,CONCAT12((char)((ushort)dstvec[4][1]._2_2_ >> 8),uVar56));
  uVar78 = CONCAT15(dstvec[5][1]._4_1_,CONCAT14((char)dstvec[4][1]._4_2_,uVar221));
  uVar82 = CONCAT17(dstvec[5][1]._5_1_,CONCAT16((char)((ushort)dstvec[4][1]._4_2_ >> 8),uVar78));
  Var88 = CONCAT19(dstvec[5][1]._6_1_,CONCAT18((char)dstvec[4][1]._6_2_,uVar82));
  auVar94[10] = (char)((ushort)dstvec[4][1]._6_2_ >> 8);
  auVar94._0_10_ = Var88;
  auVar94[0xb] = dstvec[5][1]._7_1_;
  uVar57 = CONCAT11(dstvec[7][1]._2_1_,(char)dstvec[6][1]._2_2_);
  uVar269 = CONCAT13(dstvec[7][1]._3_1_,CONCAT12((char)((ushort)dstvec[6][1]._2_2_ >> 8),uVar57));
  uVar79 = CONCAT15(dstvec[7][1]._4_1_,CONCAT14((char)dstvec[6][1]._4_2_,uVar269));
  uVar83 = CONCAT17(dstvec[7][1]._5_1_,CONCAT16((char)((ushort)dstvec[6][1]._4_2_ >> 8),uVar79));
  Var89 = CONCAT19(dstvec[7][1]._6_1_,CONCAT18((char)dstvec[6][1]._6_2_,uVar83));
  auVar95[10] = (char)((ushort)dstvec[6][1]._6_2_ >> 8);
  auVar95._0_10_ = Var89;
  auVar95[0xb] = dstvec[7][1]._7_1_;
  auVar357._0_12_ = auVar210._0_12_;
  auVar357._12_2_ = (short)Var15;
  auVar357._14_2_ = (short)Var18;
  auVar356._12_4_ = auVar357._12_4_;
  auVar356._0_10_ = auVar210._0_10_;
  auVar356._10_2_ = auVar53._0_2_;
  auVar355._10_6_ = auVar356._10_6_;
  auVar355._0_8_ = auVar210._0_8_;
  auVar355._8_2_ = auVar52._0_2_;
  auVar365._0_12_ = auVar290._0_12_;
  auVar365._12_2_ = (short)Var46;
  auVar365._14_2_ = (short)Var49;
  auVar364._12_4_ = auVar365._12_4_;
  auVar364._0_10_ = auVar290._0_10_;
  auVar364._10_2_ = auVar55._0_2_;
  auVar363._10_6_ = auVar364._10_6_;
  auVar363._0_8_ = auVar290._0_8_;
  auVar363._8_2_ = auVar54._0_2_;
  auVar90._8_2_ = (short)((uint)auVar138._12_4_ >> 0x10);
  auVar90._0_8_ = uVar174;
  auVar90._10_2_ = (short)((uint)auVar236._12_4_ >> 0x10);
  auVar84._6_2_ = uVar219;
  auVar84._0_6_ = uVar173;
  auVar84._8_4_ = auVar90._8_4_;
  auVar80._4_2_ = uVar172;
  auVar80._0_4_ = auVar138._12_4_;
  auVar80._6_6_ = auVar84._6_6_;
  auVar91._8_2_ = (short)((uint)uVar221 >> 0x10);
  auVar91._0_8_ = uVar82;
  auVar91._10_2_ = (short)((uint)uVar269 >> 0x10);
  auVar85._6_2_ = uVar57;
  auVar85._0_6_ = uVar78;
  auVar85._8_4_ = auVar91._8_4_;
  auVar81._4_2_ = uVar56;
  auVar81._0_4_ = uVar221;
  auVar81._6_6_ = auVar85._6_6_;
  d[0][0] = CONCAT44(CONCAT22(CONCAT11((undefined1)dstvec[7][0],(char)(undefined2)dstvec[6][0]),
                              auVar290._0_2_),
                     CONCAT22(CONCAT11((undefined1)dstvec[3][0],(char)dstvec[2][0]),auVar210._0_2_))
  ;
  d[0][1] = CONCAT44(CONCAT22(CONCAT11((undefined1)dstvec[7][1],(char)(undefined2)dstvec[6][1]),
                              CONCAT11((undefined1)dstvec[5][1],(char)(undefined2)dstvec[4][1])),
                     CONCAT22(CONCAT11((undefined1)dstvec[3][1],(char)dstvec[2][1]),
                              CONCAT11((undefined1)dstvec[1][1],(char)dstvec[0][1])));
  d[1][0]._0_1_ = dstvec[0][0]._1_1_;
  d[1][0]._1_1_ = dstvec[1][0]._1_1_;
  d[1][0]._2_1_ = dstvec[2][0]._1_1_;
  d[1][0]._3_1_ = dstvec[3][0]._1_1_;
  d[1][0]._5_1_ = dstvec[5][0]._1_1_;
  d[1][0]._6_1_ = (char)((ushort)(undefined2)dstvec[6][0] >> 8);
  d[1][0]._7_1_ = dstvec[7][0]._1_1_;
  d[1][1]._0_1_ = dstvec[0][1]._1_1_;
  d[1][1]._1_1_ = dstvec[1][1]._1_1_;
  d[1][1]._2_1_ = dstvec[2][1]._1_1_;
  d[1][1]._3_1_ = dstvec[3][1]._1_1_;
  d[1][1]._4_1_ = (char)((ushort)(undefined2)dstvec[4][1] >> 8);
  d[1][1]._5_1_ = dstvec[5][1]._1_1_;
  d[1][1]._6_1_ = (char)((ushort)(undefined2)dstvec[6][1] >> 8);
  d[1][1]._7_1_ = dstvec[7][1]._1_1_;
  d[2][0]._0_4_ = auVar355._8_4_;
  d[2][0]._4_4_ = auVar363._8_4_;
  d[2][1]._0_4_ = auVar80._4_4_;
  d[2][1]._4_4_ = auVar81._4_4_;
  d[3][1]._0_4_ = auVar356._12_4_;
  d[3][1]._4_4_ = auVar364._12_4_;
  auVar236._12_4_ = CONCAT22(auVar311._8_2_,auVar211._8_2_);
  auVar177._0_8_ = CONCAT26(auVar313._10_2_,CONCAT24(auVar213._10_2_,auVar236._12_4_));
  auVar177._8_2_ = auVar215._12_2_;
  auVar177._10_2_ = auVar315._12_2_;
  auVar218._12_2_ = auVar216._14_2_;
  auVar218._0_12_ = auVar177;
  auVar218._14_2_ = auVar316._14_2_;
  uVar269 = CONCAT22((short)((unkuint10)Var61 >> 0x10),(short)((unkuint10)Var60 >> 0x10));
  auVar271._0_8_ =
       CONCAT26((short)((unkuint10)Var63 >> 0x20),
                CONCAT24((short)((unkuint10)Var62 >> 0x20),uVar269));
  auVar271._8_2_ = (short)((unkuint10)Var67 >> 0x30);
  auVar271._10_2_ = (short)((unkuint10)Var69 >> 0x30);
  auVar294._12_2_ = auVar293._14_2_;
  auVar294._0_12_ = auVar271;
  auVar294._14_2_ = auVar323._14_2_;
  auVar138._12_4_ = CONCAT22((short)((uint6)uVar222 >> 0x20),(short)((uint6)uVar173 >> 0x20));
  auVar109._0_8_ =
       CONCAT26((short)((ulong)uVar223 >> 0x30),
                CONCAT24((short)((ulong)uVar174 >> 0x30),auVar138._12_4_));
  auVar109._8_2_ = (short)((unkuint10)Var86 >> 0x40);
  auVar109._10_2_ = (short)((unkuint10)Var87 >> 0x40);
  auVar162._12_2_ = auVar92._10_2_;
  auVar162._0_12_ = auVar109;
  auVar162._14_2_ = auVar93._10_2_;
  uVar221 = CONCAT22((short)((uint6)uVar79 >> 0x20),(short)((uint6)uVar78 >> 0x20));
  auVar226._0_8_ =
       CONCAT26((short)((ulong)uVar83 >> 0x30),CONCAT24((short)((ulong)uVar82 >> 0x30),uVar221));
  auVar226._8_2_ = (short)((unkuint10)Var88 >> 0x40);
  auVar226._10_2_ = (short)((unkuint10)Var89 >> 0x40);
  auVar249._12_2_ = auVar94._10_2_;
  auVar249._0_12_ = auVar226;
  auVar249._14_2_ = auVar95._10_2_;
  auVar268._8_4_ = (int)((ulong)auVar177._0_8_ >> 0x20);
  auVar268._0_8_ = auVar177._0_8_;
  auVar268._12_4_ = (int)((ulong)auVar271._0_8_ >> 0x20);
  auVar295._8_4_ = (int)((ulong)auVar109._0_8_ >> 0x20);
  auVar295._0_8_ = auVar109._0_8_;
  auVar295._12_4_ = (int)((ulong)auVar226._0_8_ >> 0x20);
  d[4][0] = CONCAT44(uVar269,auVar236._12_4_);
  d[4][1] = CONCAT44(uVar221,auVar138._12_4_);
  d[5][0] = auVar268._8_8_;
  d[5][1] = auVar295._8_8_;
  d[6][0]._0_4_ = auVar177._8_4_;
  d[6][0]._4_4_ = auVar271._8_4_;
  d[6][1]._0_4_ = auVar109._8_4_;
  d[6][1]._4_4_ = auVar226._8_4_;
  d[7][1]._0_4_ = auVar218._12_4_;
  d[7][1]._4_4_ = auVar294._12_4_;
  d[8][0]._0_4_ = auVar162._12_4_;
  d[8][0]._4_4_ = auVar249._12_4_;
  for (lVar99 = 0; lVar99 != 0x80; lVar99 = lVar99 + 0x10) {
    *(undefined8 *)dst = *(undefined8 *)((long)d[0] + lVar99);
    *(undefined8 *)(dst + stride * 8) = *(undefined8 *)((long)d[0] + lVar99 + 8);
    dst = dst + stride;
  }
  return;
LAB_002e6051:
  for (; lVar99 != 0x40; lVar99 = lVar99 + 0x10) {
    *(undefined1 (*) [16])((long)d[0] + lVar99) = auVar179;
  }
LAB_002e6057:
  auVar1._8_8_ = d[0][1];
  auVar1._0_8_ = d[0][0];
  auVar10._8_4_ = (undefined4)d[2][1];
  auVar10._0_8_ = CONCAT44(d[2][0]._4_4_,(undefined4)d[2][0]);
  auVar9._12_4_ = d[2][1]._4_4_;
  auVar9._0_12_ = auVar10;
  auVar131._0_14_ = auVar1._0_14_;
  auVar131[0xe] = (char)((ulong)d[0][0] >> 0x38);
  auVar131[0xf] = d[1][0]._7_1_;
  auVar130._14_2_ = auVar131._14_2_;
  auVar130._0_13_ = auVar1._0_13_;
  auVar130[0xd] = d[1][0]._6_1_;
  auVar129._13_3_ = auVar130._13_3_;
  auVar129._0_12_ = auVar1._0_12_;
  auVar129[0xc] = (char)((ulong)d[0][0] >> 0x30);
  auVar128._12_4_ = auVar129._12_4_;
  auVar128._0_11_ = auVar1._0_11_;
  auVar128[0xb] = d[1][0]._5_1_;
  auVar127._11_5_ = auVar128._11_5_;
  auVar127._0_10_ = auVar1._0_10_;
  auVar127[10] = (char)((ulong)d[0][0] >> 0x28);
  auVar126._10_6_ = auVar127._10_6_;
  auVar126._0_9_ = auVar1._0_9_;
  auVar126[9] = d[1][0]._4_1_;
  auVar125._9_7_ = auVar126._9_7_;
  auVar125[8] = (char)((ulong)d[0][0] >> 0x20);
  auVar125._0_8_ = d[0][0];
  Var15 = CONCAT91(CONCAT81(auVar125._8_8_,d[1][0]._3_1_),(char)((ulong)d[0][0] >> 0x18));
  auVar21._2_10_ = Var15;
  auVar21[1] = d[1][0]._2_1_;
  auVar21[0] = (char)((ulong)d[0][0] >> 0x10);
  auVar20._2_12_ = auVar21;
  auVar20[1] = d[1][0]._1_1_;
  auVar20[0] = (char)((ulong)d[0][0] >> 8);
  auVar124._0_2_ = CONCAT11((undefined1)d[1][0],(char)d[0][0]);
  auVar124._2_14_ = auVar20;
  auVar193._0_14_ = auVar9._0_14_;
  auVar193[0xe] = (char)((uint)d[2][0]._4_4_ >> 0x18);
  auVar193[0xf] = d[3][0]._7_1_;
  auVar192._14_2_ = auVar193._14_2_;
  auVar192._0_13_ = auVar9._0_13_;
  auVar192[0xd] = d[3][0]._6_1_;
  auVar191._13_3_ = auVar192._13_3_;
  auVar191[0xc] = (char)((uint)d[2][0]._4_4_ >> 0x10);
  auVar191._0_12_ = auVar10;
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._0_11_ = auVar10._0_11_;
  auVar190[0xb] = d[3][0]._5_1_;
  auVar189._11_5_ = auVar190._11_5_;
  auVar189._0_10_ = auVar10._0_10_;
  auVar189[10] = (char)((uint)d[2][0]._4_4_ >> 8);
  auVar188._10_6_ = auVar189._10_6_;
  auVar188._0_9_ = auVar10._0_9_;
  auVar188[9] = d[3][0]._4_1_;
  auVar187._9_7_ = auVar188._9_7_;
  auVar187[8] = (char)d[2][0]._4_4_;
  auVar187._0_8_ = CONCAT44(d[2][0]._4_4_,(undefined4)d[2][0]);
  Var18 = CONCAT91(CONCAT81(auVar187._8_8_,d[3][0]._3_1_),(char)((uint)(undefined4)d[2][0] >> 0x18))
  ;
  auVar23._2_10_ = Var18;
  auVar23[1] = d[3][0]._2_1_;
  auVar23[0] = (char)((uint)(undefined4)d[2][0] >> 0x10);
  auVar22._2_12_ = auVar23;
  auVar22[1] = d[3][0]._1_1_;
  auVar22[0] = (char)((uint)(undefined4)d[2][0] >> 8);
  alVar308[0]._3_1_ = (undefined1)d[3][0];
  alVar308[0]._2_1_ = (char)(undefined4)d[2][0];
  auVar230._0_12_ = auVar124._0_12_;
  auVar230._12_2_ = (short)Var15;
  auVar230._14_2_ = (short)Var18;
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._0_10_ = auVar124._0_10_;
  auVar229._10_2_ = auVar23._0_2_;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._0_8_ = auVar124._0_8_;
  auVar228._8_2_ = auVar21._0_2_;
  dstvec[0][1] = auVar228._8_8_;
  auVar24._4_8_ = dstvec[0][1];
  auVar24._2_2_ = auVar22._0_2_;
  auVar24._0_2_ = auVar20._0_2_;
  alVar308[0]._0_2_ = auVar124._0_2_;
  alVar308._4_12_ = auVar24;
  dstvec[4][1]._0_2_ = auVar129._12_2_;
  dstvec[4][1]._2_2_ = auVar191._12_2_;
  dstvec[0][0] = alVar308[0];
  alVar287[1]._4_4_ = 0;
  alVar287._0_12_ = auVar24;
  dstvec[1][0] = auVar24._0_8_;
  dstvec[1][1] = alVar287[1];
  dstvec[2][0] = dstvec[0][1];
  dstvec[2][1] = 0;
  dstvec[3][0] = (ulong)dstvec[0][1] >> 0x20;
  dstvec[3][1] = 0;
  dstvec[4][0]._0_2_ = auVar125._8_2_;
  dstvec[4][0]._2_2_ = auVar187._8_2_;
  dstvec[4][0]._4_2_ = auVar127._10_2_;
  dstvec[4][0]._6_2_ = auVar189._10_2_;
  dstvec[4][1]._4_2_ = auVar130._14_2_;
  dstvec[4][1]._6_2_ = auVar192._14_2_;
  dstvec[5][0] = CONCAT26(dstvec[4][1]._2_2_,
                          CONCAT24((undefined2)dstvec[4][1],
                                   CONCAT22(auVar189._10_2_,auVar127._10_2_)));
  dstvec[5][1] = CONCAT44(0,CONCAT22(auVar192._14_2_,auVar130._14_2_));
  dstvec[6][0]._0_2_ = (undefined2)dstvec[4][1];
  dstvec[6][0]._2_2_ = dstvec[4][1]._2_2_;
  dstvec[6][0]._4_2_ = auVar130._14_2_;
  dstvec[6][0]._6_2_ = auVar192._14_2_;
  dstvec[6][1]._0_2_ = 0;
  dstvec[6][1]._2_2_ = 0;
  dstvec[6][1]._4_2_ = 0;
  dstvec[6][1]._6_2_ = 0;
  dstvec[7][0] = CONCAT44(0,CONCAT22(auVar192._14_2_,auVar130._14_2_));
  dstvec[7][1] = 0;
  for (lVar99 = 0; lVar99 != 0x80; lVar99 = lVar99 + 0x10) {
    *(undefined4 *)dst = *(undefined4 *)((long)dstvec[0] + lVar99);
    dst = dst + stride;
  }
  return;
LAB_002e64a1:
  for (; lVar99 != 0x40; lVar99 = lVar99 + 0x10) {
    *(undefined1 (*) [16])((long)d[0] + lVar99) = auVar179;
  }
LAB_002e64a7:
  auVar2._8_8_ = d[0][1];
  auVar2._0_8_ = d[0][0];
  auVar12._8_4_ = (undefined4)d[2][1];
  auVar12._0_8_ = CONCAT44(d[2][0]._4_4_,(undefined4)d[2][0]);
  auVar11._12_4_ = d[2][1]._4_4_;
  auVar11._0_12_ = auVar12;
  auVar279._0_14_ = auVar2._0_14_;
  auVar279[0xe] = (char)((ulong)d[0][0] >> 0x38);
  auVar279[0xf] = d[1][0]._7_1_;
  auVar278._14_2_ = auVar279._14_2_;
  auVar278._0_13_ = auVar2._0_13_;
  auVar278[0xd] = d[1][0]._6_1_;
  auVar277._13_3_ = auVar278._13_3_;
  auVar277._0_12_ = auVar2._0_12_;
  auVar277[0xc] = (char)((ulong)d[0][0] >> 0x30);
  auVar276._12_4_ = auVar277._12_4_;
  auVar276._0_11_ = auVar2._0_11_;
  auVar276[0xb] = d[1][0]._5_1_;
  auVar275._11_5_ = auVar276._11_5_;
  auVar275._0_10_ = auVar2._0_10_;
  auVar275[10] = (char)((ulong)d[0][0] >> 0x28);
  auVar274._10_6_ = auVar275._10_6_;
  auVar274._0_9_ = auVar2._0_9_;
  auVar274[9] = d[1][0]._4_1_;
  auVar273._9_7_ = auVar274._9_7_;
  auVar273[8] = (char)((ulong)d[0][0] >> 0x20);
  auVar273._0_8_ = d[0][0];
  Var15 = CONCAT91(CONCAT81(auVar273._8_8_,d[1][0]._3_1_),(char)((ulong)d[0][0] >> 0x18));
  auVar36._2_10_ = Var15;
  auVar36[1] = d[1][0]._2_1_;
  auVar36[0] = (char)((ulong)d[0][0] >> 0x10);
  auVar35._2_12_ = auVar36;
  auVar35[1] = d[1][0]._1_1_;
  auVar35[0] = (char)((ulong)d[0][0] >> 8);
  auVar272._0_2_ = CONCAT11((undefined1)d[1][0],(char)d[0][0]);
  auVar272._2_14_ = auVar35;
  auVar302._0_14_ = auVar11._0_14_;
  auVar302[0xe] = (char)((uint)d[2][0]._4_4_ >> 0x18);
  auVar302[0xf] = d[3][0]._7_1_;
  auVar301._14_2_ = auVar302._14_2_;
  auVar301._0_13_ = auVar11._0_13_;
  auVar301[0xd] = d[3][0]._6_1_;
  auVar300._13_3_ = auVar301._13_3_;
  auVar300[0xc] = (char)((uint)d[2][0]._4_4_ >> 0x10);
  auVar300._0_12_ = auVar12;
  auVar299._12_4_ = auVar300._12_4_;
  auVar299._0_11_ = auVar12._0_11_;
  auVar299[0xb] = d[3][0]._5_1_;
  auVar298._11_5_ = auVar299._11_5_;
  auVar298._0_10_ = auVar12._0_10_;
  auVar298[10] = (char)((uint)d[2][0]._4_4_ >> 8);
  auVar297._10_6_ = auVar298._10_6_;
  auVar297._0_9_ = auVar12._0_9_;
  auVar297[9] = d[3][0]._4_1_;
  auVar296._9_7_ = auVar297._9_7_;
  auVar296[8] = (char)d[2][0]._4_4_;
  auVar296._0_8_ = CONCAT44(d[2][0]._4_4_,(undefined4)d[2][0]);
  Var18 = CONCAT91(CONCAT81(auVar296._8_8_,d[3][0]._3_1_),(char)((uint)(undefined4)d[2][0] >> 0x18))
  ;
  auVar38._2_10_ = Var18;
  auVar38[1] = d[3][0]._2_1_;
  auVar38[0] = (char)((uint)(undefined4)d[2][0] >> 0x10);
  auVar37._2_12_ = auVar38;
  auVar37[1] = d[3][0]._1_1_;
  auVar37[0] = (char)((uint)(undefined4)d[2][0] >> 8);
  uVar219 = CONCAT11((undefined1)d[1][1],(char)d[0][1]);
  auVar236._12_4_ = CONCAT13(d[1][1]._1_1_,CONCAT12((char)((ulong)d[0][1] >> 8),uVar219));
  uVar222 = CONCAT15(d[1][1]._2_1_,CONCAT14((char)((ulong)d[0][1] >> 0x10),auVar236._12_4_));
  uVar223 = CONCAT17(d[1][1]._3_1_,CONCAT16((char)((ulong)d[0][1] >> 0x18),uVar222));
  auVar224._0_10_ = CONCAT19(d[1][1]._4_1_,CONCAT18((char)((ulong)d[0][1] >> 0x20),uVar223));
  auVar224[10] = (char)((ulong)d[0][1] >> 0x28);
  auVar224[0xb] = d[1][1]._5_1_;
  auVar227[0xc] = (char)((ulong)d[0][1] >> 0x30);
  auVar227._0_12_ = auVar224;
  auVar227[0xd] = d[1][1]._6_1_;
  auVar238[0xe] = (char)((ulong)d[0][1] >> 0x38);
  auVar238._0_14_ = auVar227;
  auVar238[0xf] = d[1][1]._7_1_;
  uVar172 = CONCAT11((undefined1)d[3][1],(char)(undefined4)d[2][1]);
  auVar138._12_4_ = CONCAT13(d[3][1]._1_1_,CONCAT12((char)((uint)(undefined4)d[2][1] >> 8),uVar172))
  ;
  uVar173 = CONCAT15(d[3][1]._2_1_,
                     CONCAT14((char)((uint)(undefined4)d[2][1] >> 0x10),auVar138._12_4_));
  uVar174 = CONCAT17(d[3][1]._3_1_,CONCAT16((char)((uint)(undefined4)d[2][1] >> 0x18),uVar173));
  auVar175._0_10_ = CONCAT19(d[3][1]._4_1_,CONCAT18((char)d[2][1]._4_4_,uVar174));
  auVar175[10] = (char)((uint)d[2][1]._4_4_ >> 8);
  auVar175[0xb] = d[3][1]._5_1_;
  auVar178[0xc] = (char)((uint)d[2][1]._4_4_ >> 0x10);
  auVar178._0_12_ = auVar175;
  auVar178[0xd] = d[3][1]._6_1_;
  auVar202[0xe] = (char)((uint)d[2][1]._4_4_ >> 0x18);
  auVar202._0_14_ = auVar178;
  auVar202[0xf] = d[3][1]._7_1_;
  auVar144._0_12_ = auVar272._0_12_;
  auVar144._12_2_ = (short)Var15;
  auVar144._14_2_ = (short)Var18;
  auVar143._12_4_ = auVar144._12_4_;
  auVar143._0_10_ = auVar272._0_10_;
  auVar143._10_2_ = auVar38._0_2_;
  auVar142._10_6_ = auVar143._10_6_;
  auVar142._0_8_ = auVar272._0_8_;
  auVar142._8_2_ = auVar36._0_2_;
  auVar39._4_8_ = auVar142._8_8_;
  auVar39._2_2_ = auVar37._0_2_;
  auVar39._0_2_ = auVar35._0_2_;
  auVar141._0_4_ = CONCAT22(CONCAT11((undefined1)d[3][0],(char)(undefined4)d[2][0]),auVar272._0_2_);
  auVar141._4_12_ = auVar39;
  auVar263._12_2_ = (short)((ulong)uVar223 >> 0x30);
  auVar263._0_12_ = auVar224;
  auVar263._14_2_ = (short)((ulong)uVar174 >> 0x30);
  auVar262._12_4_ = auVar263._12_4_;
  auVar262._10_2_ = (short)((uint6)uVar173 >> 0x20);
  auVar262._0_10_ = auVar224._0_10_;
  auVar261._10_6_ = auVar262._10_6_;
  auVar261._8_2_ = (short)((uint6)uVar222 >> 0x20);
  auVar261._0_8_ = uVar223;
  auVar260._8_8_ = auVar261._8_8_;
  auVar260._6_2_ = (short)((uint)auVar138._12_4_ >> 0x10);
  auVar260._0_6_ = uVar222;
  auVar259._6_10_ = auVar260._6_10_;
  auVar259._4_2_ = (short)((uint)auVar236._12_4_ >> 0x10);
  auVar259._0_4_ = auVar236._12_4_;
  uVar252 = uVar172;
  uVar250 = uVar219;
  uVar251 = CONCAT22(uVar252,uVar250);
  auVar138._12_4_ = CONCAT22(auVar296._8_2_,auVar273._8_2_);
  auVar270._0_8_ = CONCAT26(auVar298._10_2_,CONCAT24(auVar275._10_2_,auVar138._12_4_));
  auVar270._8_2_ = auVar277._12_2_;
  auVar270._10_2_ = auVar300._12_2_;
  auVar280._12_2_ = auVar278._14_2_;
  auVar280._0_12_ = auVar270;
  auVar280._14_2_ = auVar301._14_2_;
  dstvec[4][0]._4_2_ = (undefined2)((unkuint10)auVar224._0_10_ >> 0x40);
  dstvec[4][0]._6_2_ = (undefined2)((unkuint10)auVar175._0_10_ >> 0x40);
  uVar98 = CONCAT22(dstvec[4][0]._6_2_,dstvec[4][0]._4_2_);
  auVar225._0_8_ = CONCAT26(auVar175._10_2_,CONCAT24(auVar224._10_2_,uVar98));
  auVar225._8_2_ = auVar227._12_2_;
  auVar225._10_2_ = auVar178._12_2_;
  auVar239._12_2_ = auVar238._14_2_;
  auVar239._0_12_ = auVar225;
  auVar239._14_2_ = auVar202._14_2_;
  auVar203._0_8_ = auVar141._0_8_;
  auVar203._8_4_ = auVar39._0_4_;
  auVar203._12_4_ = auVar259._4_4_;
  uVar220 = auVar141._0_4_;
  alVar240[0] = CONCAT44(uVar251,uVar220);
  auVar303._8_4_ = (int)((ulong)auVar270._0_8_ >> 0x20);
  auVar303._0_8_ = auVar270._0_8_;
  auVar303._12_4_ = (int)((ulong)auVar225._0_8_ >> 0x20);
  dstvec[1][1] = auVar303._8_8_;
  uVar254 = uVar98;
  uVar253 = auVar138._12_4_;
  alVar240[1] = CONCAT44(uVar254,uVar253);
  auVar145._0_8_ = CONCAT44(auVar261._8_4_,auVar142._8_4_);
  auVar145._8_4_ = auVar143._12_4_;
  auVar145._12_4_ = auVar262._12_4_;
  uVar104 = auVar225._8_4_;
  auVar281._0_8_ = CONCAT44(uVar104,auVar270._8_4_);
  auVar281._8_4_ = auVar280._12_4_;
  auVar281._12_4_ = auVar239._12_4_;
  dstvec[0][0] = alVar240[0];
  dstvec[0][1] = alVar240[1];
  alVar204[1] = dstvec[1][1];
  alVar204[0] = auVar203._8_8_;
  dstvec[1][0] = auVar203._8_8_;
  alVar264[1] = auVar281._0_8_;
  alVar264[0] = auVar145._0_8_;
  dstvec[2][0] = auVar145._0_8_;
  dstvec[2][1] = auVar281._0_8_;
  dstvec[3][1] = auVar281._8_8_;
  alVar146[1] = dstvec[3][1];
  alVar146[0] = auVar145._8_8_;
  dstvec[3][0] = auVar145._8_8_;
  dstvec[4][0]._0_2_ = auVar273._8_2_;
  dstvec[4][0]._2_2_ = auVar296._8_2_;
  dstvec[4][1]._0_2_ = 0;
  dstvec[4][1]._2_2_ = 0;
  dstvec[4][1]._4_2_ = 0;
  dstvec[4][1]._6_2_ = 0;
  dstvec[5][0] = dstvec[1][1];
  dstvec[5][1] = 0;
  dstvec[6][0]._0_2_ = auVar277._12_2_;
  dstvec[6][0]._2_2_ = auVar300._12_2_;
  dstvec[6][0]._4_2_ = auVar227._12_2_;
  dstvec[6][0]._6_2_ = auVar178._12_2_;
  dstvec[6][1]._0_2_ = 0;
  dstvec[6][1]._2_2_ = 0;
  dstvec[6][1]._4_2_ = 0;
  dstvec[6][1]._6_2_ = 0;
  dstvec[7][0] = dstvec[3][1];
  dstvec[7][1] = 0;
  dstvec[8][0] = SUB168((undefined1  [16])alVar240 >> 0x20,0);
  dstvec[8][1] = SUB168((undefined1  [16])alVar240 >> 0x20,8);
  dstvec[9][0] = SUB168((undefined1  [16])alVar204 >> 0x20,0);
  dstvec[9][1] = SUB168((undefined1  [16])alVar204 >> 0x20,8);
  dstvec[10][0] = SUB168((undefined1  [16])alVar264 >> 0x20,0);
  dstvec[10][1] = SUB168((undefined1  [16])alVar264 >> 0x20,8);
  dstvec[0xb][0] = SUB168((undefined1  [16])alVar146 >> 0x20,0);
  dstvec[0xb][1] = SUB168((undefined1  [16])alVar146 >> 0x20,8);
  dstvec[0xc][0] = SUB168(ZEXT416(uVar98),0);
  dstvec[0xc][1] = SUB168(ZEXT416(uVar98),8);
  dstvec[0xd][0] = (ulong)dstvec[1][1] >> 0x20;
  dstvec[0xd][1] = 0;
  dstvec[0xe][0] = SUB168(ZEXT416(uVar104),0);
  dstvec[0xe][1] = SUB168(ZEXT416(uVar104),8);
  dstvec[0xf][0] = (ulong)dstvec[3][1] >> 0x20;
  dstvec[0xf][1] = 0;
  for (lVar99 = 0; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
    *(undefined4 *)dst = *(undefined4 *)((long)dstvec[0] + lVar99);
    dst = dst + stride;
  }
  return;
LAB_002e6db3:
  for (; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
    *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar179;
  }
LAB_002e6dbc:
  transpose16x16_sse2(dstvec,d);
  for (lVar99 = 0; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
    uVar174 = *(undefined8 *)((long)d[0] + lVar99 + 8);
    *(undefined8 *)dst = *(undefined8 *)((long)d[0] + lVar99);
    *(undefined8 *)(dst + 8) = uVar174;
    dst = dst + stride;
  }
  return;
LAB_002e67b1:
  for (; lVar99 != 0x100; lVar99 = lVar99 + 0x10) {
    *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar179;
  }
LAB_002e67ba:
  for (lVar99 = 0x40; lVar99 != 0x80; lVar99 = lVar99 + 0x10) {
    *(undefined1 (*) [16])((long)d[0] + lVar99) = (undefined1  [16])0x0;
  }
  transpose16x8_8x16_sse2
            (dstvec,dstvec + 1,dstvec + 2,dstvec + 3,dstvec + 4,dstvec + 5,dstvec + 6,dstvec + 7,
             dstvec + 8,dstvec + 9,dstvec + 10,dstvec + 0xb,dstvec + 0xc,dstvec + 0xd,dstvec + 0xe,
             dstvec + 0xf,d,d + 1,d + 2,d + 3,d + 4,d + 5,d + 6,d + 7);
  for (lVar99 = 0; lVar99 != 0x40; lVar99 = lVar99 + 0x10) {
    uVar174 = *(undefined8 *)((long)d[0] + lVar99 + 8);
    *(undefined8 *)dst = *(undefined8 *)((long)d[0] + lVar99);
    *(undefined8 *)(dst + 8) = uVar174;
    dst = dst + stride;
  }
  return;
LAB_002e5e6d:
  while( true ) {
    if (lVar99 == 0x40) break;
    *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar179;
    lVar99 = lVar99 + 0x10;
  }
LAB_002e5e73:
  auVar119[0xe] = dstvec[0][0]._7_1_;
  auVar119._0_14_ = dstvec[0]._0_14_;
  auVar119[0xf] = dstvec[1][0]._7_1_;
  auVar118._14_2_ = auVar119._14_2_;
  auVar118._0_13_ = dstvec[0]._0_13_;
  auVar118[0xd] = dstvec[1][0]._6_1_;
  auVar117._13_3_ = auVar118._13_3_;
  auVar117._0_12_ = dstvec[0]._0_12_;
  auVar117[0xc] = dstvec[0][0]._6_1_;
  auVar116._12_4_ = auVar117._12_4_;
  auVar116._0_11_ = dstvec[0]._0_11_;
  auVar116[0xb] = dstvec[1][0]._5_1_;
  auVar115._11_5_ = auVar116._11_5_;
  auVar115._0_10_ = dstvec[0]._0_10_;
  auVar115[10] = dstvec[0][0]._5_1_;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._0_9_ = dstvec[0]._0_9_;
  auVar114[9] = dstvec[1][0]._4_1_;
  auVar113._9_7_ = auVar114._9_7_;
  auVar113._0_8_ = dstvec[0][0];
  auVar113[8] = dstvec[0][0]._4_1_;
  Var15 = CONCAT91(CONCAT81(auVar113._8_8_,dstvec[1][0]._3_1_),dstvec[0][0]._3_1_);
  auVar14._2_10_ = Var15;
  auVar14[1] = dstvec[1][0]._2_1_;
  auVar14[0] = dstvec[0][0]._2_1_;
  auVar13._2_12_ = auVar14;
  auVar13[1] = dstvec[1][0]._1_1_;
  auVar13[0] = dstvec[0][0]._1_1_;
  uVar375 = CONCAT11((undefined1)dstvec[1][0],(char)dstvec[0][0]);
  auVar112._2_14_ = auVar13;
  auVar186[0xe] = dstvec[2][0]._7_1_;
  auVar186._0_14_ = dstvec[2]._0_14_;
  auVar186[0xf] = dstvec[3][0]._7_1_;
  auVar185._14_2_ = auVar186._14_2_;
  auVar185._0_13_ = dstvec[2]._0_13_;
  auVar185[0xd] = dstvec[3][0]._6_1_;
  auVar184._13_3_ = auVar185._13_3_;
  auVar184._0_12_ = dstvec[2]._0_12_;
  auVar184[0xc] = dstvec[2][0]._6_1_;
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._0_11_ = dstvec[2]._0_11_;
  auVar183[0xb] = dstvec[3][0]._5_1_;
  auVar182._11_5_ = auVar183._11_5_;
  auVar182._0_10_ = dstvec[2]._0_10_;
  auVar182[10] = dstvec[2][0]._5_1_;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._0_9_ = dstvec[2]._0_9_;
  auVar181[9] = dstvec[3][0]._4_1_;
  auVar180._9_7_ = auVar181._9_7_;
  auVar180._0_8_ = dstvec[2][0];
  auVar180[8] = dstvec[2][0]._4_1_;
  Var18 = CONCAT91(CONCAT81(auVar180._8_8_,dstvec[3][0]._3_1_),dstvec[2][0]._3_1_);
  auVar17._2_10_ = Var18;
  auVar17[1] = dstvec[3][0]._2_1_;
  auVar17[0] = dstvec[2][0]._2_1_;
  auVar16._2_12_ = auVar17;
  auVar16[1] = dstvec[3][0]._1_1_;
  auVar16[0] = dstvec[2][0]._1_1_;
  auVar122._0_12_ = auVar112._0_12_;
  auVar122._12_2_ = (short)Var15;
  auVar122._14_2_ = (short)Var18;
  auVar121._12_4_ = auVar122._12_4_;
  auVar121._0_10_ = auVar112._0_10_;
  auVar121._10_2_ = auVar17._0_2_;
  auVar120._10_6_ = auVar121._10_6_;
  auVar120._0_8_ = auVar112._0_8_;
  auVar120._8_2_ = auVar14._0_2_;
  auVar19._4_8_ = auVar120._8_8_;
  auVar19._2_2_ = auVar16._0_2_;
  auVar19._0_2_ = auVar13._0_2_;
  *(uint *)dst = CONCAT22(CONCAT11((undefined1)dstvec[3][0],(char)dstvec[2][0]),uVar375);
  *(int *)(dst + stride) = auVar19._0_4_;
  *(int *)(dst + stride * 2) = auVar120._8_4_;
  *(undefined4 *)(dst + stride * 3) = auVar121._12_4_;
  return;
LAB_002e6942:
  while( true ) {
    if (lVar99 == 0x80) break;
    *(undefined1 (*) [16])((long)dstvec[0] + lVar99) = auVar179;
    lVar99 = lVar99 + 0x10;
  }
LAB_002e694b:
  uVar98 = CONCAT22((undefined2)dstvec[4][1],dstvec[4][0]._6_2_);
  auVar206._0_9_ = (unkuint9)uVar98 << 0x30;
  uVar58 = CONCAT24(dstvec[4][1]._2_2_,uVar98);
  auVar66._6_5_ = 0;
  auVar66._0_6_ = uVar58;
  auVar207._0_11_ = auVar66 << 0x30;
  auVar74._8_5_ = 0;
  auVar74._0_8_ = CONCAT26(dstvec[4][1]._4_2_,uVar58);
  auVar208._0_13_ = auVar74 << 0x30;
  uVar104 = CONCAT22((undefined2)dstvec[6][1],dstvec[6][0]._6_2_);
  auVar265._0_9_ = (unkuint9)uVar104 << 0x30;
  uVar59 = CONCAT24(dstvec[6][1]._2_2_,uVar104);
  auVar68._6_5_ = 0;
  auVar68._0_6_ = uVar59;
  auVar266._0_11_ = auVar68 << 0x30;
  auVar75._8_5_ = 0;
  auVar75._0_8_ = CONCAT26(dstvec[6][1]._4_2_,uVar59);
  auVar267._0_13_ = auVar75 << 0x30;
  auVar156[0xe] = dstvec[0][0]._7_1_;
  auVar156._0_14_ = dstvec[0]._0_14_;
  auVar156[0xf] = dstvec[1][0]._7_1_;
  auVar155._14_2_ = auVar156._14_2_;
  auVar155._0_13_ = dstvec[0]._0_13_;
  auVar155[0xd] = dstvec[1][0]._6_1_;
  auVar154._13_3_ = auVar155._13_3_;
  auVar154._0_12_ = dstvec[0]._0_12_;
  auVar154[0xc] = dstvec[0][0]._6_1_;
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._0_11_ = dstvec[0]._0_11_;
  auVar153[0xb] = dstvec[1][0]._5_1_;
  auVar152._11_5_ = auVar153._11_5_;
  auVar152._0_10_ = dstvec[0]._0_10_;
  auVar152[10] = dstvec[0][0]._5_1_;
  auVar151._10_6_ = auVar152._10_6_;
  auVar151._0_9_ = dstvec[0]._0_9_;
  auVar151[9] = dstvec[1][0]._4_1_;
  auVar150._9_7_ = auVar151._9_7_;
  auVar150._0_8_ = dstvec[0][0];
  auVar150[8] = dstvec[0][0]._4_1_;
  Var15 = CONCAT91(CONCAT81(auVar150._8_8_,dstvec[1][0]._3_1_),dstvec[0][0]._3_1_);
  auVar41._2_10_ = Var15;
  auVar41[1] = dstvec[1][0]._2_1_;
  auVar41[0] = dstvec[0][0]._2_1_;
  auVar40._2_12_ = auVar41;
  auVar40[1] = dstvec[1][0]._1_1_;
  auVar40[0] = dstvec[0][0]._1_1_;
  auVar149._0_2_ = CONCAT11((undefined1)dstvec[1][0],(char)dstvec[0][0]);
  auVar149._2_14_ = auVar40;
  auVar247[0xe] = dstvec[2][0]._7_1_;
  auVar247._0_14_ = dstvec[2]._0_14_;
  auVar247[0xf] = dstvec[3][0]._7_1_;
  auVar246._14_2_ = auVar247._14_2_;
  auVar246._0_13_ = dstvec[2]._0_13_;
  auVar246[0xd] = dstvec[3][0]._6_1_;
  auVar245._13_3_ = auVar246._13_3_;
  auVar245._0_12_ = dstvec[2]._0_12_;
  auVar245[0xc] = dstvec[2][0]._6_1_;
  auVar244._12_4_ = auVar245._12_4_;
  auVar244._0_11_ = dstvec[2]._0_11_;
  auVar244[0xb] = dstvec[3][0]._5_1_;
  auVar243._11_5_ = auVar244._11_5_;
  auVar243._0_10_ = dstvec[2]._0_10_;
  auVar243[10] = dstvec[2][0]._5_1_;
  auVar242._10_6_ = auVar243._10_6_;
  auVar242._0_9_ = dstvec[2]._0_9_;
  auVar242[9] = dstvec[3][0]._4_1_;
  auVar241._9_7_ = auVar242._9_7_;
  auVar241._0_8_ = dstvec[2][0];
  auVar241[8] = dstvec[2][0]._4_1_;
  Var18 = CONCAT91(CONCAT81(auVar241._8_8_,dstvec[3][0]._3_1_),dstvec[2][0]._3_1_);
  auVar43._2_10_ = Var18;
  auVar43[1] = dstvec[3][0]._2_1_;
  auVar43[0] = dstvec[2][0]._2_1_;
  auVar42._2_12_ = auVar43;
  auVar42[1] = dstvec[3][0]._1_1_;
  auVar42[0] = dstvec[2][0]._1_1_;
  auVar208._14_2_ =
       (undefined2)
       (CONCAT19(dstvec[5][0]._7_1_,
                 CONCAT18((char)((ushort)dstvec[4][0]._6_2_ >> 8),
                          CONCAT26(dstvec[4][1]._4_2_,uVar58))) >> 0x40);
  auVar208[0xd] = dstvec[5][0]._6_1_;
  Var67 = CONCAT37(auVar208._13_3_,CONCAT16((char)dstvec[4][0]._6_2_,uVar58));
  auVar207._12_4_ = (undefined4)((unkuint10)Var67 >> 0x30);
  auVar207[0xb] = dstvec[5][0]._5_1_;
  Var62 = CONCAT55(auVar207._11_5_,CONCAT14((char)((ushort)dstvec[4][0]._4_2_ >> 8),uVar98));
  auVar206._10_6_ = (undefined6)((unkuint10)Var62 >> 0x20);
  auVar206[9] = dstvec[5][0]._4_1_;
  Var60 = CONCAT73(auVar206._9_7_,CONCAT12((char)dstvec[4][0]._4_2_,dstvec[4][0]._6_2_));
  Var46 = CONCAT91(CONCAT81((long)((unkuint10)Var60 >> 0x10),dstvec[5][0]._3_1_),
                   (char)((ushort)dstvec[4][0]._2_2_ >> 8));
  auVar45._2_10_ = Var46;
  auVar45[1] = dstvec[5][0]._2_1_;
  auVar45[0] = (char)dstvec[4][0]._2_2_;
  auVar44._2_12_ = auVar45;
  auVar44[1] = dstvec[5][0]._1_1_;
  auVar44[0] = (char)((ushort)(undefined2)dstvec[4][0] >> 8);
  auVar205._0_2_ = CONCAT11((undefined1)dstvec[5][0],(char)(undefined2)dstvec[4][0]);
  auVar205._2_14_ = auVar44;
  auVar267._14_2_ =
       (undefined2)
       (CONCAT19(dstvec[7][0]._7_1_,
                 CONCAT18((char)((ushort)dstvec[6][0]._6_2_ >> 8),
                          CONCAT26(dstvec[6][1]._4_2_,uVar59))) >> 0x40);
  auVar267[0xd] = dstvec[7][0]._6_1_;
  Var69 = CONCAT37(auVar267._13_3_,CONCAT16((char)dstvec[6][0]._6_2_,uVar59));
  auVar266._12_4_ = (undefined4)((unkuint10)Var69 >> 0x30);
  auVar266[0xb] = dstvec[7][0]._5_1_;
  Var63 = CONCAT55(auVar266._11_5_,CONCAT14((char)((ushort)dstvec[6][0]._4_2_ >> 8),uVar104));
  auVar265._10_6_ = (undefined6)((unkuint10)Var63 >> 0x20);
  auVar265[9] = dstvec[7][0]._4_1_;
  Var61 = CONCAT73(auVar265._9_7_,CONCAT12((char)dstvec[6][0]._4_2_,dstvec[6][0]._6_2_));
  Var49 = CONCAT91(CONCAT81((long)((unkuint10)Var61 >> 0x10),dstvec[7][0]._3_1_),
                   (char)((ushort)dstvec[6][0]._2_2_ >> 8));
  auVar48._2_10_ = Var49;
  auVar48[1] = dstvec[7][0]._2_1_;
  auVar48[0] = (char)dstvec[6][0]._2_2_;
  auVar47._2_12_ = auVar48;
  auVar47[1] = dstvec[7][0]._1_1_;
  auVar47[0] = (char)((ushort)(undefined2)dstvec[6][0] >> 8);
  auVar285._0_12_ = auVar149._0_12_;
  auVar285._12_2_ = (short)Var15;
  auVar285._14_2_ = (short)Var18;
  auVar284._12_4_ = auVar285._12_4_;
  auVar284._0_10_ = auVar149._0_10_;
  auVar284._10_2_ = auVar43._0_2_;
  auVar283._10_6_ = auVar284._10_6_;
  auVar283._0_8_ = auVar149._0_8_;
  auVar283._8_2_ = auVar41._0_2_;
  auVar50._4_8_ = auVar283._8_8_;
  auVar50._2_2_ = auVar42._0_2_;
  auVar50._0_2_ = auVar40._0_2_;
  auVar282._0_4_ = CONCAT22(CONCAT11((undefined1)dstvec[3][0],(char)dstvec[2][0]),auVar149._0_2_);
  auVar282._4_12_ = auVar50;
  auVar306._0_12_ = auVar205._0_12_;
  auVar306._12_2_ = (short)Var46;
  auVar306._14_2_ = (short)Var49;
  auVar305._12_4_ = auVar306._12_4_;
  auVar305._0_10_ = auVar205._0_10_;
  auVar305._10_2_ = auVar48._0_2_;
  auVar304._10_6_ = auVar305._10_6_;
  auVar304._0_8_ = auVar205._0_8_;
  auVar304._8_2_ = auVar45._0_2_;
  auVar51._4_8_ = auVar304._8_8_;
  auVar51._2_2_ = auVar47._0_2_;
  auVar51._0_2_ = auVar44._0_2_;
  auVar319._0_8_ = auVar282._0_8_;
  auVar319._8_4_ = auVar50._0_4_;
  auVar319._12_4_ = auVar51._0_4_;
  *(ulong *)dst =
       CONCAT44(CONCAT22(CONCAT11((undefined1)dstvec[7][0],(char)(undefined2)dstvec[6][0]),
                         auVar205._0_2_),auVar282._0_4_);
  *(long *)(dst + stride) = auVar319._8_8_;
  auVar138._12_4_ = CONCAT22(auVar241._8_2_,auVar150._8_2_);
  auVar108._0_8_ = CONCAT26(auVar243._10_2_,CONCAT24(auVar152._10_2_,auVar138._12_4_));
  auVar108._8_2_ = auVar154._12_2_;
  auVar108._10_2_ = auVar245._12_2_;
  auVar157._12_2_ = auVar155._14_2_;
  auVar157._0_12_ = auVar108;
  auVar157._14_2_ = auVar246._14_2_;
  auVar236._12_4_ = CONCAT22((short)((unkuint10)Var61 >> 0x10),(short)((unkuint10)Var60 >> 0x10));
  auVar176._0_8_ =
       CONCAT26((short)((unkuint10)Var63 >> 0x20),
                CONCAT24((short)((unkuint10)Var62 >> 0x20),auVar236._12_4_));
  auVar176._8_2_ = (short)((unkuint10)Var67 >> 0x30);
  auVar176._10_2_ = (short)((unkuint10)Var69 >> 0x30);
  auVar209._12_2_ = auVar208._14_2_;
  auVar209._0_12_ = auVar176;
  auVar209._14_2_ = auVar267._14_2_;
  *(int *)(dst + stride * 2) = auVar283._8_4_;
  *(int *)(dst + stride * 2 + 4) = auVar304._8_4_;
  *(undefined4 *)(dst + stride * 3 + 8) = auVar284._12_4_;
  *(undefined4 *)(dst + stride * 3 + 0xc) = auVar305._12_4_;
  auVar248._8_4_ = (int)((ulong)auVar108._0_8_ >> 0x20);
  auVar248._0_8_ = auVar108._0_8_;
  auVar248._12_4_ = (int)((ulong)auVar176._0_8_ >> 0x20);
  *(ulong *)(dst + stride * 4) = CONCAT44(auVar236._12_4_,auVar138._12_4_);
  *(long *)(dst + stride * 5) = auVar248._8_8_;
  auVar138._12_4_ = auVar157._12_4_;
  auVar236._12_4_ = auVar209._12_4_;
  *(int *)(dst + stride * 6) = auVar108._8_4_;
  *(int *)(dst + stride * 6 + 4) = auVar176._8_4_;
  lVar99 = stride * 7;
LAB_002e6a02:
  *(undefined4 *)(dst + lVar99 + 8) = auVar138._12_4_;
  *(undefined4 *)(dst + lVar99 + 0xc) = auVar236._12_4_;
  return;
}

Assistant:

void av1_dr_prediction_z3_sse4_1(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                                 const uint8_t *above, const uint8_t *left,
                                 int upsample_left, int dx, int dy) {
  (void)above;
  (void)dx;
  assert(dx == 1);
  assert(dy > 0);

  if (bw == bh) {
    switch (bw) {
      case 4:
        dr_prediction_z3_4x4_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 8:
        dr_prediction_z3_8x8_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 16:
        dr_prediction_z3_16x16_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 32:
        dr_prediction_z3_32x32_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      case 64:
        dr_prediction_z3_64x64_sse4_1(dst, stride, left, upsample_left, dy);
        break;
      default: assert(0 && "Invalid block size");
    }
  } else {
    if (bw < bh) {
      if (bw + bw == bh) {
        switch (bw) {
          case 4:
            dr_prediction_z3_4x8_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x32_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_32x64_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
        }
      } else {
        switch (bw) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_4x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_8x32_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_16x64_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    } else {
      if (bh + bh == bw) {
        switch (bh) {
          case 4:
            dr_prediction_z3_8x4_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_16x8_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_32x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 32:
            dr_prediction_z3_64x32_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
        }
      } else {
        switch (bh) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            dr_prediction_z3_16x4_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 8:
            dr_prediction_z3_32x8_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          case 16:
            dr_prediction_z3_64x16_sse4_1(dst, stride, left, upsample_left, dy);
            break;
          default: assert(0 && "Invalid block size");
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    }
  }
}